

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O1

void embree::avx2::CurveNvIntersector1<8>::
     intersect_t<embree::avx2::SweepCurve1Intersector1<embree::BezierCurveT>,embree::avx2::Intersect1Epilog1<true>>
               (Precalculations *pre,RayHit *ray,RayQueryContext *context,Primitive *prim)

{
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  float fVar8;
  float fVar9;
  float fVar10;
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  int iVar14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  bool bVar58;
  undefined1 auVar59 [12];
  bool bVar60;
  bool bVar61;
  bool bVar62;
  bool bVar63;
  bool bVar64;
  bool bVar65;
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  uint uVar80;
  ulong uVar81;
  uint uVar82;
  ulong uVar83;
  undefined4 uVar84;
  ulong uVar85;
  long lVar86;
  bool bVar87;
  float fVar88;
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 extraout_var [60];
  undefined1 auVar110 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  float fVar111;
  float fVar142;
  float fVar143;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar130 [32];
  float fVar144;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar141 [32];
  undefined1 auVar152 [16];
  float fVar161;
  float fVar162;
  float fVar163;
  undefined1 auVar153 [32];
  float fVar160;
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [64];
  float fVar184;
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  float fVar201;
  float fVar204;
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar196 [32];
  undefined1 auVar189 [16];
  undefined1 auVar197 [32];
  undefined1 auVar190 [28];
  float fVar199;
  float fVar200;
  float fVar202;
  float fVar203;
  undefined1 auVar198 [64];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined4 uVar266;
  undefined1 auVar261 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar211 [16];
  undefined1 auVar212 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [64];
  undefined1 auVar219 [16];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined8 uVar224;
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  float fVar233;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [32];
  undefined1 auVar230 [32];
  undefined1 auVar231 [32];
  undefined1 auVar232 [64];
  undefined1 auVar237 [32];
  undefined1 auVar234 [16];
  undefined1 auVar235 [16];
  undefined1 auVar236 [32];
  undefined1 auVar238 [32];
  undefined1 auVar239 [64];
  undefined1 auVar240 [64];
  undefined1 auVar241 [28];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [64];
  undefined1 auVar245 [64];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  float fVar250;
  float fVar251;
  float fVar252;
  undefined1 in_ZMM10 [64];
  undefined1 auVar248 [64];
  undefined1 auVar249 [64];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 in_ZMM12 [64];
  undefined4 uVar265;
  undefined1 auVar262 [32];
  undefined1 auVar263 [32];
  undefined1 auVar264 [32];
  float fVar270;
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  undefined1 auVar267 [32];
  undefined1 auVar268 [32];
  undefined1 auVar269 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [32];
  undefined1 auVar285 [32];
  undefined1 auVar286 [32];
  RTCFilterFunctionNArguments args;
  vfloatx_conflict u_outer1;
  vfloatx_conflict u_outer0;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  int local_aec;
  ulong local_ae8;
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  undefined1 local_aa0 [32];
  RTCFilterFunctionNArguments local_a70;
  undefined1 local_a40 [32];
  undefined1 local_a10 [8];
  float fStack_a08;
  float fStack_a04;
  undefined1 local_a00 [16];
  undefined1 local_9f0 [16];
  undefined1 local_9e0 [16];
  undefined8 local_9d0;
  float local_9c8;
  float local_9c4;
  undefined4 local_9c0;
  uint local_9bc;
  uint local_9b8;
  uint local_9b4;
  uint local_9b0;
  undefined1 local_9a0 [32];
  undefined1 local_980 [32];
  undefined1 local_960 [32];
  undefined1 local_940 [32];
  undefined1 local_920 [8];
  float fStack_918;
  float fStack_914;
  undefined1 auStack_910 [16];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [32];
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [8];
  float fStack_7f8;
  float fStack_7f4;
  undefined1 auStack_7f0 [16];
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined1 local_7d0 [16];
  Primitive *local_7b8;
  Primitive *local_7b0;
  ulong local_7a8;
  undefined1 local_7a0 [32];
  undefined1 local_780 [8];
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  undefined4 uStack_764;
  undefined1 local_760 [8];
  float fStack_758;
  float fStack_754;
  float fStack_750;
  float fStack_74c;
  float fStack_748;
  float fStack_744;
  undefined1 local_740 [32];
  undefined1 local_720 [8];
  float fStack_718;
  float fStack_714;
  float fStack_710;
  float fStack_70c;
  float fStack_708;
  float fStack_704;
  undefined1 local_700 [32];
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [8];
  float fStack_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float fStack_688;
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined1 local_620 [8];
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  undefined1 local_600 [8];
  float fStack_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float fStack_5e8;
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [8];
  float fStack_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float fStack_568;
  float fStack_564;
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [8];
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [32];
  undefined1 local_480 [32];
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  float local_440;
  float fStack_43c;
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  float fStack_424;
  undefined1 local_420 [32];
  undefined1 local_400 [32];
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [8];
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_3a0 [32];
  undefined1 local_380 [32];
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  float local_340;
  float fStack_33c;
  float fStack_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float fStack_328;
  float fStack_324;
  float local_320;
  float fStack_31c;
  float fStack_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float fStack_308;
  float fStack_304;
  undefined4 local_300;
  undefined4 uStack_2fc;
  undefined4 uStack_2f8;
  undefined4 uStack_2f4;
  undefined4 uStack_2f0;
  undefined4 uStack_2ec;
  undefined4 uStack_2e8;
  undefined4 uStack_2e4;
  undefined1 local_2e0 [32];
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  float afStack_140 [2];
  uint auStack_138 [66];
  
  PVar5 = prim[1];
  uVar85 = (ulong)(byte)PVar5;
  lVar86 = uVar85 * 0x19;
  fVar111 = *(float *)(prim + lVar86 + 0x12);
  auVar95 = vsubps_avx((undefined1  [16])(ray->super_RayK<1>).org.field_0,
                       *(undefined1 (*) [16])(prim + lVar86 + 6));
  auVar89._0_4_ = fVar111 * auVar95._0_4_;
  auVar89._4_4_ = fVar111 * auVar95._4_4_;
  auVar89._8_4_ = fVar111 * auVar95._8_4_;
  auVar89._12_4_ = fVar111 * auVar95._12_4_;
  auVar225._0_4_ = fVar111 * (ray->super_RayK<1>).dir.field_0.m128[0];
  auVar225._4_4_ = fVar111 * (ray->super_RayK<1>).dir.field_0.m128[1];
  auVar225._8_4_ = fVar111 * (ray->super_RayK<1>).dir.field_0.m128[2];
  auVar225._12_4_ = fVar111 * (ray->super_RayK<1>).dir.field_0.m128[3];
  auVar95._8_8_ = 0;
  auVar95._0_8_ = *(ulong *)(prim + uVar85 * 4 + 6);
  auVar104 = vpmovsxbd_avx2(auVar95);
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar186._8_8_ = 0;
  auVar186._0_8_ = *(ulong *)(prim + uVar85 * 5 + 6);
  auVar98 = vpmovsxbd_avx2(auVar186);
  auVar98 = vcvtdq2ps_avx(auVar98);
  auVar210._8_8_ = 0;
  auVar210._0_8_ = *(ulong *)(prim + uVar85 * 6 + 6);
  auVar140 = vpmovsxbd_avx2(auVar210);
  auVar140 = vcvtdq2ps_avx(auVar140);
  auVar118._8_8_ = 0;
  auVar118._0_8_ = *(ulong *)(prim + uVar85 * 0xb + 6);
  auVar12 = vpmovsxbd_avx2(auVar118);
  auVar12 = vcvtdq2ps_avx(auVar12);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + (ulong)((uint)(byte)PVar5 * 0xc) + 6);
  auVar154 = vpmovsxbd_avx2(auVar3);
  auVar154 = vcvtdq2ps_avx(auVar154);
  auVar261._8_8_ = 0;
  auVar261._0_8_ = *(ulong *)(prim + (uint)(byte)PVar5 * 0xc + uVar85 + 6);
  auVar221 = vpmovsxbd_avx2(auVar261);
  auVar221 = vcvtdq2ps_avx(auVar221);
  uVar81 = (ulong)(uint)((int)(uVar85 * 9) * 2);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar13 = vpmovsxbd_avx2(auVar4);
  auVar13 = vcvtdq2ps_avx(auVar13);
  auVar127._8_8_ = 0;
  auVar127._0_8_ = *(ulong *)(prim + uVar81 + uVar85 + 6);
  auVar179 = vpmovsxbd_avx2(auVar127);
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar256 = ZEXT3264(auVar179);
  uVar81 = (ulong)(uint)((int)(uVar85 * 5) << 2);
  auVar151._8_8_ = 0;
  auVar151._0_8_ = *(ulong *)(prim + uVar81 + 6);
  auVar246 = vpmovsxbd_avx2(auVar151);
  auVar246 = vcvtdq2ps_avx(auVar246);
  auVar267._4_4_ = auVar225._0_4_;
  auVar267._0_4_ = auVar225._0_4_;
  auVar267._8_4_ = auVar225._0_4_;
  auVar267._12_4_ = auVar225._0_4_;
  auVar267._16_4_ = auVar225._0_4_;
  auVar267._20_4_ = auVar225._0_4_;
  auVar267._24_4_ = auVar225._0_4_;
  auVar267._28_4_ = auVar225._0_4_;
  auVar95 = vmovshdup_avx(auVar225);
  uVar224 = auVar95._0_8_;
  auVar279._8_8_ = uVar224;
  auVar279._0_8_ = uVar224;
  auVar279._16_8_ = uVar224;
  auVar279._24_8_ = uVar224;
  auVar95 = vshufps_avx(auVar225,auVar225,0xaa);
  fVar111 = auVar95._0_4_;
  auVar183._0_4_ = fVar111 * auVar140._0_4_;
  fVar88 = auVar95._4_4_;
  auVar183._4_4_ = fVar88 * auVar140._4_4_;
  auVar183._8_4_ = fVar111 * auVar140._8_4_;
  auVar183._12_4_ = fVar88 * auVar140._12_4_;
  auVar183._16_4_ = fVar111 * auVar140._16_4_;
  auVar183._20_4_ = fVar88 * auVar140._20_4_;
  auVar183._28_36_ = in_ZMM12._28_36_;
  auVar183._24_4_ = fVar111 * auVar140._24_4_;
  auVar248._0_4_ = auVar221._0_4_ * fVar111;
  auVar248._4_4_ = auVar221._4_4_ * fVar88;
  auVar248._8_4_ = auVar221._8_4_ * fVar111;
  auVar248._12_4_ = auVar221._12_4_ * fVar88;
  auVar248._16_4_ = auVar221._16_4_ * fVar111;
  auVar248._20_4_ = auVar221._20_4_ * fVar88;
  auVar248._28_36_ = in_ZMM10._28_36_;
  auVar248._24_4_ = auVar221._24_4_ * fVar111;
  auVar242._0_4_ = auVar246._0_4_ * fVar111;
  auVar242._4_4_ = auVar246._4_4_ * fVar88;
  auVar242._8_4_ = auVar246._8_4_ * fVar111;
  auVar242._12_4_ = auVar246._12_4_ * fVar88;
  auVar242._16_4_ = auVar246._16_4_ * fVar111;
  auVar242._20_4_ = auVar246._20_4_ * fVar88;
  auVar242._24_4_ = auVar246._24_4_ * fVar111;
  auVar242._28_4_ = 0;
  auVar95 = vfmadd231ps_fma(auVar183._0_32_,auVar279,auVar98);
  auVar186 = vfmadd231ps_fma(auVar248._0_32_,auVar279,auVar154);
  auVar210 = vfmadd231ps_fma(auVar242,auVar179,auVar279);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar267,auVar104);
  auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar267,auVar12);
  auVar248 = ZEXT1664(auVar186);
  auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar13,auVar267);
  auVar268._4_4_ = auVar89._0_4_;
  auVar268._0_4_ = auVar89._0_4_;
  auVar268._8_4_ = auVar89._0_4_;
  auVar268._12_4_ = auVar89._0_4_;
  auVar268._16_4_ = auVar89._0_4_;
  auVar268._20_4_ = auVar89._0_4_;
  auVar268._24_4_ = auVar89._0_4_;
  auVar268._28_4_ = auVar89._0_4_;
  auVar95 = vmovshdup_avx(auVar89);
  uVar224 = auVar95._0_8_;
  auVar280._8_8_ = uVar224;
  auVar280._0_8_ = uVar224;
  auVar280._16_8_ = uVar224;
  auVar280._24_8_ = uVar224;
  auVar95 = vshufps_avx(auVar89,auVar89,0xaa);
  fVar111 = auVar95._0_4_;
  auVar227._0_4_ = fVar111 * auVar140._0_4_;
  fVar88 = auVar95._4_4_;
  auVar227._4_4_ = fVar88 * auVar140._4_4_;
  auVar227._8_4_ = fVar111 * auVar140._8_4_;
  auVar227._12_4_ = fVar88 * auVar140._12_4_;
  auVar227._16_4_ = fVar111 * auVar140._16_4_;
  auVar227._20_4_ = fVar88 * auVar140._20_4_;
  auVar227._24_4_ = fVar111 * auVar140._24_4_;
  auVar227._28_4_ = 0;
  auVar263._4_4_ = auVar221._4_4_ * fVar88;
  auVar263._0_4_ = auVar221._0_4_ * fVar111;
  auVar263._8_4_ = auVar221._8_4_ * fVar111;
  auVar263._12_4_ = auVar221._12_4_ * fVar88;
  auVar263._16_4_ = auVar221._16_4_ * fVar111;
  auVar263._20_4_ = auVar221._20_4_ * fVar88;
  auVar263._24_4_ = auVar221._24_4_ * fVar111;
  auVar263._28_4_ = auVar140._28_4_;
  auVar140._4_4_ = auVar246._4_4_ * fVar88;
  auVar140._0_4_ = auVar246._0_4_ * fVar111;
  auVar140._8_4_ = auVar246._8_4_ * fVar111;
  auVar140._12_4_ = auVar246._12_4_ * fVar88;
  auVar140._16_4_ = auVar246._16_4_ * fVar111;
  auVar140._20_4_ = auVar246._20_4_ * fVar88;
  auVar140._24_4_ = auVar246._24_4_ * fVar111;
  auVar140._28_4_ = fVar88;
  auVar95 = vfmadd231ps_fma(auVar227,auVar280,auVar98);
  auVar3 = vfmadd231ps_fma(auVar263,auVar280,auVar154);
  auVar261 = vfmadd231ps_fma(auVar140,auVar280,auVar179);
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar268,auVar104);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar268,auVar12);
  local_7a0._8_4_ = 0x7fffffff;
  local_7a0._0_8_ = 0x7fffffff7fffffff;
  local_7a0._12_4_ = 0x7fffffff;
  local_7a0._16_4_ = 0x7fffffff;
  local_7a0._20_4_ = 0x7fffffff;
  local_7a0._24_4_ = 0x7fffffff;
  local_7a0._28_4_ = 0x7fffffff;
  auVar236._8_4_ = 0x219392ef;
  auVar236._0_8_ = 0x219392ef219392ef;
  auVar236._12_4_ = 0x219392ef;
  auVar236._16_4_ = 0x219392ef;
  auVar236._20_4_ = 0x219392ef;
  auVar236._24_4_ = 0x219392ef;
  auVar236._28_4_ = 0x219392ef;
  auVar104 = vandps_avx(ZEXT1632(auVar118),local_7a0);
  auVar104 = vcmpps_avx(auVar104,auVar236,1);
  auVar98 = vblendvps_avx(ZEXT1632(auVar118),auVar236,auVar104);
  auVar104 = vandps_avx(ZEXT1632(auVar186),local_7a0);
  auVar104 = vcmpps_avx(auVar104,auVar236,1);
  auVar140 = vblendvps_avx(ZEXT1632(auVar186),auVar236,auVar104);
  auVar104 = vandps_avx(ZEXT1632(auVar210),local_7a0);
  auVar104 = vcmpps_avx(auVar104,auVar236,1);
  auVar104 = vblendvps_avx(ZEXT1632(auVar210),auVar236,auVar104);
  auVar118 = vfmadd231ps_fma(ZEXT1632(auVar261),auVar268,auVar13);
  auVar12 = vrcpps_avx(auVar98);
  auVar212._8_4_ = 0x3f800000;
  auVar212._0_8_ = &DAT_3f8000003f800000;
  auVar212._12_4_ = 0x3f800000;
  auVar212._16_4_ = 0x3f800000;
  auVar212._20_4_ = 0x3f800000;
  auVar212._24_4_ = 0x3f800000;
  auVar212._28_4_ = 0x3f800000;
  auVar95 = vfnmadd213ps_fma(auVar98,auVar12,auVar212);
  auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar12,auVar12);
  auVar98 = vrcpps_avx(auVar140);
  auVar186 = vfnmadd213ps_fma(auVar140,auVar98,auVar212);
  auVar186 = vfmadd132ps_fma(ZEXT1632(auVar186),auVar98,auVar98);
  auVar98 = vrcpps_avx(auVar104);
  auVar210 = vfnmadd213ps_fma(auVar104,auVar98,auVar212);
  auVar210 = vfmadd132ps_fma(ZEXT1632(auVar210),auVar98,auVar98);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 7 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar4));
  auVar12._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar12._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar12._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar12._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar12._16_4_ = auVar104._16_4_ * 0.0;
  auVar12._20_4_ = auVar104._20_4_ * 0.0;
  auVar12._24_4_ = auVar104._24_4_ * 0.0;
  auVar12._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 9 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar4));
  auVar154._4_4_ = auVar95._4_4_ * auVar104._4_4_;
  auVar154._0_4_ = auVar95._0_4_ * auVar104._0_4_;
  auVar154._8_4_ = auVar95._8_4_ * auVar104._8_4_;
  auVar154._12_4_ = auVar95._12_4_ * auVar104._12_4_;
  auVar154._16_4_ = auVar104._16_4_ * 0.0;
  auVar154._20_4_ = auVar104._20_4_ * 0.0;
  auVar154._24_4_ = auVar104._24_4_ * 0.0;
  auVar154._28_4_ = auVar104._28_4_;
  auVar130._1_3_ = 0;
  auVar130[0] = PVar5;
  auVar98 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + (ulong)(byte)PVar5 * 0x10 + 6));
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])
                             (prim + (ulong)(byte)PVar5 * 0x10 + uVar85 * -2 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar3));
  auVar221._4_4_ = auVar104._4_4_ * auVar186._4_4_;
  auVar221._0_4_ = auVar104._0_4_ * auVar186._0_4_;
  auVar221._8_4_ = auVar104._8_4_ * auVar186._8_4_;
  auVar221._12_4_ = auVar104._12_4_ * auVar186._12_4_;
  auVar221._16_4_ = auVar104._16_4_ * 0.0;
  auVar221._20_4_ = auVar104._20_4_ * 0.0;
  auVar221._24_4_ = auVar104._24_4_ * 0.0;
  auVar221._28_4_ = auVar104._28_4_;
  auVar104 = vcvtdq2ps_avx(auVar98);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar3));
  auVar13._4_4_ = auVar186._4_4_ * auVar104._4_4_;
  auVar13._0_4_ = auVar186._0_4_ * auVar104._0_4_;
  auVar13._8_4_ = auVar186._8_4_ * auVar104._8_4_;
  auVar13._12_4_ = auVar186._12_4_ * auVar104._12_4_;
  auVar13._16_4_ = auVar104._16_4_ * 0.0;
  auVar13._20_4_ = auVar104._20_4_ * 0.0;
  auVar13._24_4_ = auVar104._24_4_ * 0.0;
  auVar13._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar81 + uVar85 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar118));
  auVar179._4_4_ = auVar104._4_4_ * auVar210._4_4_;
  auVar179._0_4_ = auVar104._0_4_ * auVar210._0_4_;
  auVar179._8_4_ = auVar104._8_4_ * auVar210._8_4_;
  auVar179._12_4_ = auVar104._12_4_ * auVar210._12_4_;
  auVar179._16_4_ = auVar104._16_4_ * 0.0;
  auVar179._20_4_ = auVar104._20_4_ * 0.0;
  auVar179._24_4_ = auVar104._24_4_ * 0.0;
  auVar179._28_4_ = auVar104._28_4_;
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x17 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,ZEXT1632(auVar118));
  auVar246._4_4_ = auVar210._4_4_ * auVar104._4_4_;
  auVar246._0_4_ = auVar210._0_4_ * auVar104._0_4_;
  auVar246._8_4_ = auVar210._8_4_ * auVar104._8_4_;
  auVar246._12_4_ = auVar210._12_4_ * auVar104._12_4_;
  auVar246._16_4_ = auVar104._16_4_ * 0.0;
  auVar246._20_4_ = auVar104._20_4_ * 0.0;
  auVar246._24_4_ = auVar104._24_4_ * 0.0;
  auVar246._28_4_ = auVar104._28_4_;
  auVar104 = vpminsd_avx2(auVar12,auVar154);
  auVar98 = vpminsd_avx2(auVar221,auVar13);
  auVar104 = vmaxps_avx(auVar104,auVar98);
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
  auVar228._4_4_ = uVar84;
  auVar228._0_4_ = uVar84;
  auVar228._8_4_ = uVar84;
  auVar228._12_4_ = uVar84;
  auVar228._16_4_ = uVar84;
  auVar228._20_4_ = uVar84;
  auVar228._24_4_ = uVar84;
  auVar228._28_4_ = uVar84;
  auVar98 = vpminsd_avx2(auVar179,auVar246);
  auVar98 = vmaxps_avx(auVar98,auVar228);
  auVar104 = vmaxps_avx(auVar104,auVar98);
  local_3a0._4_4_ = auVar104._4_4_ * 0.99999964;
  local_3a0._0_4_ = auVar104._0_4_ * 0.99999964;
  local_3a0._8_4_ = auVar104._8_4_ * 0.99999964;
  local_3a0._12_4_ = auVar104._12_4_ * 0.99999964;
  local_3a0._16_4_ = auVar104._16_4_ * 0.99999964;
  local_3a0._20_4_ = auVar104._20_4_ * 0.99999964;
  local_3a0._24_4_ = auVar104._24_4_ * 0.99999964;
  local_3a0._28_4_ = auVar98._28_4_;
  auVar104 = vpmaxsd_avx2(auVar12,auVar154);
  auVar98 = vpmaxsd_avx2(auVar221,auVar13);
  auVar104 = vminps_avx(auVar104,auVar98);
  auVar98 = vpmaxsd_avx2(auVar179,auVar246);
  fVar111 = (ray->super_RayK<1>).tfar;
  auVar153._4_4_ = fVar111;
  auVar153._0_4_ = fVar111;
  auVar153._8_4_ = fVar111;
  auVar153._12_4_ = fVar111;
  auVar153._16_4_ = fVar111;
  auVar153._20_4_ = fVar111;
  auVar153._24_4_ = fVar111;
  auVar153._28_4_ = fVar111;
  auVar98 = vminps_avx(auVar98,auVar153);
  auVar104 = vminps_avx(auVar104,auVar98);
  auVar11._4_4_ = auVar104._4_4_ * 1.0000004;
  auVar11._0_4_ = auVar104._0_4_ * 1.0000004;
  auVar11._8_4_ = auVar104._8_4_ * 1.0000004;
  auVar11._12_4_ = auVar104._12_4_ * 1.0000004;
  auVar11._16_4_ = auVar104._16_4_ * 1.0000004;
  auVar11._20_4_ = auVar104._20_4_ * 1.0000004;
  auVar11._24_4_ = auVar104._24_4_ * 1.0000004;
  auVar11._28_4_ = auVar104._28_4_;
  auVar130[4] = PVar5;
  auVar130._5_3_ = 0;
  auVar130[8] = PVar5;
  auVar130._9_3_ = 0;
  auVar130[0xc] = PVar5;
  auVar130._13_3_ = 0;
  auVar130[0x10] = PVar5;
  auVar130._17_3_ = 0;
  auVar130[0x14] = PVar5;
  auVar130._21_3_ = 0;
  auVar130[0x18] = PVar5;
  auVar130._25_3_ = 0;
  auVar130[0x1c] = PVar5;
  auVar130._29_3_ = 0;
  auVar98 = vpcmpgtd_avx2(auVar130,_DAT_0205a920);
  auVar104 = vcmpps_avx(local_3a0,auVar11,2);
  auVar104 = vandps_avx(auVar104,auVar98);
  uVar82 = vmovmskps_avx(auVar104);
  if (uVar82 == 0) {
    return;
  }
  uVar82 = uVar82 & 0xff;
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_380 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
  local_7b0 = prim;
  local_7b8 = prim + lVar86 + 0x16;
LAB_018111df:
  lVar86 = 0;
  local_7a8 = (ulong)uVar82;
  for (uVar85 = local_7a8; (uVar85 & 1) == 0; uVar85 = uVar85 >> 1 | 0x8000000000000000) {
    lVar86 = lVar86 + 1;
  }
  local_7a8 = local_7a8 - 1 & local_7a8;
  uVar82 = *(uint *)(local_7b0 + lVar86 * 4 + 6);
  uVar85 = (ulong)(uint)((int)lVar86 << 6);
  auVar95 = *(undefined1 (*) [16])(local_7b8 + uVar85);
  if (local_7a8 != 0) {
    uVar83 = local_7a8 - 1 & local_7a8;
    for (uVar81 = local_7a8; (uVar81 & 1) == 0; uVar81 = uVar81 >> 1 | 0x8000000000000000) {
    }
    if (uVar83 != 0) {
      for (; (uVar83 & 1) == 0; uVar83 = uVar83 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar186 = *(undefined1 (*) [16])(local_7b8 + uVar85 + 0x10);
  auVar210 = *(undefined1 (*) [16])(local_7b8 + uVar85 + 0x20);
  auVar118 = *(undefined1 (*) [16])(local_7b8 + uVar85 + 0x30);
  auVar205._0_4_ = (auVar95._0_4_ + auVar186._0_4_ + auVar210._0_4_ + auVar118._0_4_) * 0.25;
  auVar205._4_4_ = (auVar95._4_4_ + auVar186._4_4_ + auVar210._4_4_ + auVar118._4_4_) * 0.25;
  auVar205._8_4_ = (auVar95._8_4_ + auVar186._8_4_ + auVar210._8_4_ + auVar118._8_4_) * 0.25;
  auVar205._12_4_ = (auVar95._12_4_ + auVar186._12_4_ + auVar210._12_4_ + auVar118._12_4_) * 0.25;
  aVar1 = (ray->super_RayK<1>).org.field_0;
  aVar2 = (ray->super_RayK<1>).dir.field_0.field_1;
  auVar3 = vsubps_avx(auVar205,(undefined1  [16])aVar1);
  auVar3 = vdpps_avx(auVar3,(undefined1  [16])aVar2,0x7f);
  auVar261 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
  local_ae8 = (ulong)*(uint *)(local_7b0 + 2);
  auVar4 = vrcpss_avx(auVar261,auVar261);
  auVar239 = ZEXT1664(auVar4);
  auVar261 = vfnmadd213ss_fma(auVar4,auVar261,ZEXT416(0x40000000));
  auVar244 = ZEXT1664(auVar261);
  fVar111 = auVar4._0_4_ * auVar261._0_4_;
  auVar232 = ZEXT464((uint)fVar111);
  fVar111 = auVar3._0_4_ * fVar111;
  local_7d0 = ZEXT416((uint)fVar111);
  auVar206._4_4_ = fVar111;
  auVar206._0_4_ = fVar111;
  auVar206._8_4_ = fVar111;
  auVar206._12_4_ = fVar111;
  fStack_750 = fVar111;
  _local_760 = auVar206;
  fStack_74c = fVar111;
  fStack_748 = fVar111;
  fStack_744 = fVar111;
  auVar3 = vfmadd231ps_fma((undefined1  [16])aVar1,(undefined1  [16])aVar2,auVar206);
  auVar3 = vblendps_avx(auVar3,_DAT_01feba10,8);
  local_9e0 = vsubps_avx(auVar95,auVar3);
  local_9f0 = vsubps_avx(auVar210,auVar3);
  auVar183 = ZEXT1664(local_9f0);
  local_a00 = vsubps_avx(auVar186,auVar3);
  _local_a10 = vsubps_avx(auVar118,auVar3);
  auVar198 = ZEXT1664(_local_a10);
  auVar95 = vmovshdup_avx(local_9e0);
  local_1a0 = auVar95._0_8_;
  uStack_198 = local_1a0;
  uStack_190 = local_1a0;
  uStack_188 = local_1a0;
  auVar95 = vshufps_avx(local_9e0,local_9e0,0xaa);
  local_1c0 = auVar95._0_8_;
  uStack_1b8 = local_1c0;
  uStack_1b0 = local_1c0;
  uStack_1a8 = local_1c0;
  auVar95 = vshufps_avx(local_9e0,local_9e0,0xff);
  local_1e0 = auVar95._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar95 = vmovshdup_avx(local_a00);
  local_200 = auVar95._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar95 = vshufps_avx(local_a00,local_a00,0xaa);
  local_220 = auVar95._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar95 = vshufps_avx(local_a00,local_a00,0xff);
  local_240 = auVar95._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar95 = vmovshdup_avx(local_9f0);
  local_440 = auVar95._0_4_;
  fStack_43c = auVar95._4_4_;
  auVar95 = vshufps_avx(local_9f0,local_9f0,0xaa);
  local_460 = auVar95._0_4_;
  fStack_45c = auVar95._4_4_;
  auVar95 = vshufps_avx(local_9f0,local_9f0,0xff);
  local_260 = auVar95._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar95 = vmovshdup_avx(_local_a10);
  local_280 = auVar95._0_8_;
  uStack_278 = local_280;
  uStack_270 = local_280;
  uStack_268 = local_280;
  auVar95 = vshufps_avx(_local_a10,_local_a10,0xaa);
  local_2a0 = auVar95._0_8_;
  uStack_298 = local_2a0;
  uStack_290 = local_2a0;
  uStack_288 = local_2a0;
  auVar95 = vshufps_avx(_local_a10,_local_a10,0xff);
  local_2c0 = auVar95._0_8_;
  uStack_2b8 = local_2c0;
  uStack_2b0 = local_2c0;
  uStack_2a8 = local_2c0;
  auVar90._0_4_ = aVar2.x * aVar2.x;
  auVar90._4_4_ = aVar2.y * aVar2.y;
  auVar90._8_4_ = aVar2.z * aVar2.z;
  auVar90._12_4_ = aVar2.field_3.w * aVar2.field_3.w;
  auVar95 = vshufps_avx(auVar90,auVar90,0xaa);
  auVar98._0_8_ = auVar95._0_8_;
  auVar98._8_8_ = auVar98._0_8_;
  auVar98._16_8_ = auVar98._0_8_;
  auVar98._24_8_ = auVar98._0_8_;
  uVar84 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
  local_600._4_4_ = uVar84;
  local_600._0_4_ = uVar84;
  fStack_5f8 = (float)uVar84;
  fStack_5f4 = (float)uVar84;
  fStack_5f0 = (float)uVar84;
  fStack_5ec = (float)uVar84;
  fStack_5e8 = (float)uVar84;
  register0x0000125c = uVar84;
  uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
  local_620._4_4_ = uVar84;
  local_620._0_4_ = uVar84;
  fStack_618 = (float)uVar84;
  fStack_614 = (float)uVar84;
  fStack_610 = (float)uVar84;
  fStack_60c = (float)uVar84;
  fStack_608 = (float)uVar84;
  register0x0000135c = uVar84;
  auVar218 = ZEXT3264(_local_620);
  auVar95 = vfmadd231ps_fma(auVar98,_local_620,_local_620);
  auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),_local_600,_local_600);
  uVar85 = 1;
  uVar81 = 0;
  local_640 = (ray->super_RayK<1>).dir.field_0.m128[2];
  fStack_63c = local_640;
  fStack_638 = local_640;
  fStack_634 = local_640;
  fStack_630 = local_640;
  fStack_62c = local_640;
  fStack_628 = local_640;
  fStack_624 = local_640;
  local_300 = local_9e0._0_4_;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2f0 = local_300;
  uStack_2ec = local_300;
  uStack_2e8 = local_300;
  uStack_2e4 = local_300;
  local_320 = local_a00._0_4_;
  fStack_31c = local_320;
  fStack_318 = local_320;
  fStack_314 = local_320;
  fStack_310 = local_320;
  fStack_30c = local_320;
  fStack_308 = local_320;
  fStack_304 = local_320;
  local_340 = local_9f0._0_4_;
  fStack_33c = local_340;
  fStack_338 = local_340;
  fStack_334 = local_340;
  fStack_330 = local_340;
  fStack_32c = local_340;
  fStack_328 = local_340;
  fStack_324 = local_340;
  local_360 = local_a10._0_4_;
  fStack_35c = local_360;
  fStack_358 = local_360;
  fStack_354 = local_360;
  fStack_350 = local_360;
  fStack_34c = local_360;
  fStack_348 = local_360;
  fStack_344 = local_360;
  local_2e0 = ZEXT1632(auVar95);
  local_480 = vandps_avx(ZEXT1632(auVar95),local_7a0);
  local_7e0 = 0x3f80000000000000;
  uStack_7d8 = 0;
  fStack_458 = local_460;
  fStack_454 = fStack_45c;
  fStack_450 = local_460;
  fStack_44c = fStack_45c;
  fStack_448 = local_460;
  fStack_444 = fStack_45c;
  fStack_438 = local_440;
  fStack_434 = fStack_43c;
  fStack_430 = local_440;
  fStack_42c = fStack_43c;
  fStack_428 = local_440;
  fStack_424 = fStack_43c;
  do {
    auVar66._8_8_ = uStack_7d8;
    auVar66._0_8_ = local_7e0;
    auVar95 = vmovshdup_avx(auVar66);
    local_980._0_4_ = (undefined4)local_7e0;
    fVar111 = auVar95._0_4_ - (float)local_980._0_4_;
    fVar147 = fVar111 * 0.04761905;
    local_980._4_4_ = (float)local_980._0_4_;
    local_980._8_4_ = (float)local_980._0_4_;
    local_980._12_4_ = (float)local_980._0_4_;
    local_980._16_4_ = local_980._0_4_;
    local_980._20_4_ = local_980._0_4_;
    local_980._24_4_ = local_980._0_4_;
    local_980._28_4_ = local_980._0_4_;
    local_860._4_4_ = fVar111;
    local_860._0_4_ = fVar111;
    local_860._8_4_ = fVar111;
    local_860._12_4_ = fVar111;
    local_860._16_4_ = fVar111;
    local_860._20_4_ = fVar111;
    local_860._24_4_ = fVar111;
    local_860._28_4_ = fVar111;
    auVar95 = vfmadd231ps_fma(local_980,local_860,_DAT_02020f20);
    auVar281._8_4_ = 0x3f800000;
    auVar281._0_8_ = &DAT_3f8000003f800000;
    auVar281._12_4_ = 0x3f800000;
    auVar281._16_4_ = 0x3f800000;
    auVar281._20_4_ = 0x3f800000;
    auVar281._24_4_ = 0x3f800000;
    auVar281._28_4_ = 0x3f800000;
    auVar104 = vsubps_avx(auVar281,ZEXT1632(auVar95));
    auVar71._4_4_ = fStack_31c;
    auVar71._0_4_ = local_320;
    auVar71._8_4_ = fStack_318;
    auVar71._12_4_ = fStack_314;
    auVar71._16_4_ = fStack_310;
    auVar71._20_4_ = fStack_30c;
    auVar71._24_4_ = fStack_308;
    auVar71._28_4_ = fStack_304;
    fVar111 = auVar95._0_4_;
    auVar257._0_4_ = local_320 * fVar111;
    fVar88 = auVar95._4_4_;
    auVar257._4_4_ = fStack_31c * fVar88;
    fVar142 = auVar95._8_4_;
    auVar257._8_4_ = fStack_318 * fVar142;
    fVar272 = auVar95._12_4_;
    auVar257._12_4_ = fStack_314 * fVar272;
    auVar257._16_4_ = fStack_310 * 0.0;
    auVar257._20_4_ = fStack_30c * 0.0;
    auVar257._28_36_ = auVar256._28_36_;
    auVar257._24_4_ = fStack_308 * 0.0;
    auVar76._8_8_ = uStack_1f8;
    auVar76._0_8_ = local_200;
    auVar76._16_8_ = uStack_1f0;
    auVar76._24_8_ = uStack_1e8;
    auVar249._0_4_ = (float)local_200 * fVar111;
    auVar249._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar88;
    auVar249._8_4_ = (float)uStack_1f8 * fVar142;
    auVar249._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar272;
    auVar249._16_4_ = (float)uStack_1f0 * 0.0;
    auVar249._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar249._28_36_ = auVar248._28_36_;
    auVar249._24_4_ = (float)uStack_1e8 * 0.0;
    auVar75._8_8_ = uStack_218;
    auVar75._0_8_ = local_220;
    auVar75._16_8_ = uStack_210;
    auVar75._24_8_ = uStack_208;
    auVar245._0_4_ = (float)local_220 * fVar111;
    auVar245._4_4_ = (float)((ulong)local_220 >> 0x20) * fVar88;
    auVar245._8_4_ = (float)uStack_218 * fVar142;
    auVar245._12_4_ = (float)((ulong)uStack_218 >> 0x20) * fVar272;
    auVar245._16_4_ = (float)uStack_210 * 0.0;
    auVar245._20_4_ = (float)((ulong)uStack_210 >> 0x20) * 0.0;
    auVar245._28_36_ = auVar244._28_36_;
    auVar245._24_4_ = (float)uStack_208 * 0.0;
    auVar74._8_8_ = uStack_238;
    auVar74._0_8_ = local_240;
    auVar74._16_8_ = uStack_230;
    auVar74._24_8_ = uStack_228;
    auVar244._0_4_ = (float)local_240 * fVar111;
    auVar244._4_4_ = (float)((ulong)local_240 >> 0x20) * fVar88;
    auVar244._8_4_ = (float)uStack_238 * fVar142;
    auVar244._12_4_ = (float)((ulong)uStack_238 >> 0x20) * fVar272;
    auVar244._16_4_ = (float)uStack_230 * 0.0;
    auVar244._20_4_ = (float)((ulong)uStack_230 >> 0x20) * 0.0;
    auVar244._28_36_ = auVar232._28_36_;
    auVar244._24_4_ = (float)uStack_228 * 0.0;
    auVar72._4_4_ = uStack_2fc;
    auVar72._0_4_ = local_300;
    auVar72._8_4_ = uStack_2f8;
    auVar72._12_4_ = uStack_2f4;
    auVar72._16_4_ = uStack_2f0;
    auVar72._20_4_ = uStack_2ec;
    auVar72._24_4_ = uStack_2e8;
    auVar72._28_4_ = uStack_2e4;
    auVar95 = vfmadd231ps_fma(auVar257._0_32_,auVar104,auVar72);
    auVar79._8_8_ = uStack_198;
    auVar79._0_8_ = local_1a0;
    auVar79._16_8_ = uStack_190;
    auVar79._24_8_ = uStack_188;
    auVar186 = vfmadd231ps_fma(auVar249._0_32_,auVar104,auVar79);
    auVar78._8_8_ = uStack_1b8;
    auVar78._0_8_ = local_1c0;
    auVar78._16_8_ = uStack_1b0;
    auVar78._24_8_ = uStack_1a8;
    auVar210 = vfmadd231ps_fma(auVar245._0_32_,auVar104,auVar78);
    auVar77._8_8_ = uStack_1d8;
    auVar77._0_8_ = local_1e0;
    auVar77._16_8_ = uStack_1d0;
    auVar77._24_8_ = uStack_1c8;
    auVar118 = vfmadd231ps_fma(auVar244._0_32_,auVar104,auVar77);
    auVar70._4_4_ = fStack_33c;
    auVar70._0_4_ = local_340;
    auVar70._8_4_ = fStack_338;
    auVar70._12_4_ = fStack_334;
    auVar70._16_4_ = fStack_330;
    auVar70._20_4_ = fStack_32c;
    auVar70._24_4_ = fStack_328;
    auVar70._28_4_ = fStack_324;
    auVar240._0_4_ = local_340 * fVar111;
    auVar240._4_4_ = fStack_33c * fVar88;
    auVar240._8_4_ = fStack_338 * fVar142;
    auVar240._12_4_ = fStack_334 * fVar272;
    auVar240._16_4_ = fStack_330 * 0.0;
    auVar240._20_4_ = fStack_32c * 0.0;
    auVar240._28_36_ = auVar239._28_36_;
    auVar240._24_4_ = fStack_328 * 0.0;
    auVar232._0_4_ = fVar111 * local_440;
    auVar232._4_4_ = fVar88 * fStack_43c;
    auVar232._8_4_ = fVar142 * fStack_438;
    auVar232._12_4_ = fVar272 * fStack_434;
    auVar232._16_4_ = fStack_430 * 0.0;
    auVar232._20_4_ = fStack_42c * 0.0;
    auVar232._28_36_ = auVar218._28_36_;
    auVar232._24_4_ = fStack_428 * 0.0;
    auVar218._0_4_ = fVar111 * local_460;
    auVar218._4_4_ = fVar88 * fStack_45c;
    auVar218._8_4_ = fVar142 * fStack_458;
    auVar218._12_4_ = fVar272 * fStack_454;
    auVar218._16_4_ = fStack_450 * 0.0;
    auVar218._20_4_ = fStack_44c * 0.0;
    auVar218._28_36_ = auVar198._28_36_;
    auVar218._24_4_ = fStack_448 * 0.0;
    auVar73._8_8_ = uStack_258;
    auVar73._0_8_ = local_260;
    auVar73._16_8_ = uStack_250;
    auVar73._24_8_ = uStack_248;
    auVar256._0_4_ = (float)local_260 * fVar111;
    auVar256._4_4_ = (float)((ulong)local_260 >> 0x20) * fVar88;
    auVar256._8_4_ = (float)uStack_258 * fVar142;
    auVar256._12_4_ = (float)((ulong)uStack_258 >> 0x20) * fVar272;
    auVar256._16_4_ = (float)uStack_250 * 0.0;
    auVar256._20_4_ = (float)((ulong)uStack_250 >> 0x20) * 0.0;
    auVar256._28_36_ = auVar183._28_36_;
    auVar256._24_4_ = (float)uStack_248 * 0.0;
    auVar3 = vfmadd231ps_fma(auVar240._0_32_,auVar104,auVar71);
    auVar261 = vfmadd231ps_fma(auVar232._0_32_,auVar104,auVar76);
    auVar4 = vfmadd231ps_fma(auVar218._0_32_,auVar104,auVar75);
    auVar127 = vfmadd231ps_fma(auVar256._0_32_,auVar104,auVar74);
    auVar15._4_4_ = fVar88 * fStack_35c;
    auVar15._0_4_ = fVar111 * local_360;
    auVar15._8_4_ = fVar142 * fStack_358;
    auVar15._12_4_ = fVar272 * fStack_354;
    auVar15._16_4_ = fStack_350 * 0.0;
    auVar15._20_4_ = fStack_34c * 0.0;
    auVar15._24_4_ = fStack_348 * 0.0;
    auVar15._28_4_ = (int)((ulong)uStack_228 >> 0x20);
    auVar16._4_4_ = fVar88 * local_280._4_4_;
    auVar16._0_4_ = fVar111 * (float)local_280;
    auVar16._8_4_ = fVar142 * (float)uStack_278;
    auVar16._12_4_ = fVar272 * uStack_278._4_4_;
    auVar16._16_4_ = (float)uStack_270 * 0.0;
    auVar16._20_4_ = uStack_270._4_4_ * 0.0;
    auVar16._24_4_ = (float)uStack_268 * 0.0;
    auVar16._28_4_ = (int)((ulong)uStack_208 >> 0x20);
    auVar17._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar17._0_28_ =
         ZEXT1628(CONCAT412(auVar3._12_4_ * fVar272,
                            CONCAT48(auVar3._8_4_ * fVar142,
                                     CONCAT44(auVar3._4_4_ * fVar88,auVar3._0_4_ * fVar111))));
    auVar95 = vfmadd231ps_fma(auVar17,auVar104,ZEXT1632(auVar95));
    auVar186 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar272 * auVar261._12_4_,
                                                  CONCAT48(fVar142 * auVar261._8_4_,
                                                           CONCAT44(fVar88 * auVar261._4_4_,
                                                                    fVar111 * auVar261._0_4_)))),
                               auVar104,ZEXT1632(auVar186));
    auVar210 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar272 * auVar4._12_4_,
                                                  CONCAT48(fVar142 * auVar4._8_4_,
                                                           CONCAT44(fVar88 * auVar4._4_4_,
                                                                    fVar111 * auVar4._0_4_)))),
                               auVar104,ZEXT1632(auVar210));
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar272 * auVar127._12_4_,
                                                  CONCAT48(fVar142 * auVar127._8_4_,
                                                           CONCAT44(fVar88 * auVar127._4_4_,
                                                                    fVar111 * auVar127._0_4_)))),
                               auVar104,ZEXT1632(auVar118));
    auVar229._0_4_ = fVar111 * (float)local_2a0;
    auVar229._4_4_ = fVar88 * local_2a0._4_4_;
    auVar229._8_4_ = fVar142 * (float)uStack_298;
    auVar229._12_4_ = fVar272 * uStack_298._4_4_;
    auVar229._16_4_ = (float)uStack_290 * 0.0;
    auVar229._20_4_ = uStack_290._4_4_ * 0.0;
    auVar229._24_4_ = (float)uStack_288 * 0.0;
    auVar229._28_4_ = 0;
    auVar151 = vfmadd231ps_fma(auVar15,auVar104,auVar70);
    auVar3 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar151._12_4_ * fVar272,
                                                CONCAT48(auVar151._8_4_ * fVar142,
                                                         CONCAT44(auVar151._4_4_ * fVar88,
                                                                  auVar151._0_4_ * fVar111)))),
                             auVar104,ZEXT1632(auVar3));
    auVar237._0_4_ = fVar111 * (float)local_2c0;
    auVar237._4_4_ = fVar88 * local_2c0._4_4_;
    auVar237._8_4_ = fVar142 * (float)uStack_2b8;
    auVar237._12_4_ = fVar272 * uStack_2b8._4_4_;
    auVar237._16_4_ = (float)uStack_2b0 * 0.0;
    auVar237._20_4_ = uStack_2b0._4_4_ * 0.0;
    auVar237._24_4_ = (float)uStack_2a8 * 0.0;
    auVar237._28_4_ = 0;
    auVar69._4_4_ = fStack_43c;
    auVar69._0_4_ = local_440;
    auVar69._8_4_ = fStack_438;
    auVar69._12_4_ = fStack_434;
    auVar69._16_4_ = fStack_430;
    auVar69._20_4_ = fStack_42c;
    auVar69._24_4_ = fStack_428;
    auVar69._28_4_ = fStack_424;
    auVar151 = vfmadd231ps_fma(auVar16,auVar104,auVar69);
    auVar68._4_4_ = fStack_45c;
    auVar68._0_4_ = local_460;
    auVar68._8_4_ = fStack_458;
    auVar68._12_4_ = fStack_454;
    auVar68._16_4_ = fStack_450;
    auVar68._20_4_ = fStack_44c;
    auVar68._24_4_ = fStack_448;
    auVar68._28_4_ = fStack_444;
    auVar89 = vfmadd231ps_fma(auVar229,auVar104,auVar68);
    auVar225 = vfmadd231ps_fma(auVar237,auVar104,auVar73);
    auVar18._28_4_ = fStack_324;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(auVar225._12_4_ * fVar272,
                            CONCAT48(auVar225._8_4_ * fVar142,
                                     CONCAT44(auVar225._4_4_ * fVar88,auVar225._0_4_ * fVar111))));
    auVar261 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar151._12_4_ * fVar272,
                                                  CONCAT48(auVar151._8_4_ * fVar142,
                                                           CONCAT44(auVar151._4_4_ * fVar88,
                                                                    auVar151._0_4_ * fVar111)))),
                               auVar104,ZEXT1632(auVar261));
    auVar4 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar272 * auVar89._12_4_,
                                                CONCAT48(fVar142 * auVar89._8_4_,
                                                         CONCAT44(fVar88 * auVar89._4_4_,
                                                                  fVar111 * auVar89._0_4_)))),
                             auVar104,ZEXT1632(auVar4));
    auVar127 = vfmadd231ps_fma(auVar18,auVar104,ZEXT1632(auVar127));
    auVar19._28_4_ = fStack_304;
    auVar19._0_28_ =
         ZEXT1628(CONCAT412(auVar261._12_4_ * fVar272,
                            CONCAT48(auVar261._8_4_ * fVar142,
                                     CONCAT44(auVar261._4_4_ * fVar88,auVar261._0_4_ * fVar111))));
    auVar20._28_4_ = (int)((ulong)uStack_248 >> 0x20);
    auVar20._0_28_ =
         ZEXT1628(CONCAT412(fVar272 * auVar4._12_4_,
                            CONCAT48(fVar142 * auVar4._8_4_,
                                     CONCAT44(fVar88 * auVar4._4_4_,fVar111 * auVar4._0_4_))));
    auVar151 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * fVar272,
                                                  CONCAT48(auVar3._8_4_ * fVar142,
                                                           CONCAT44(auVar3._4_4_ * fVar88,
                                                                    auVar3._0_4_ * fVar111)))),
                               auVar104,ZEXT1632(auVar95));
    auVar89 = vfmadd231ps_fma(auVar19,auVar104,ZEXT1632(auVar186));
    local_ae0 = ZEXT1632(auVar89);
    auVar89 = vfmadd231ps_fma(auVar20,auVar104,ZEXT1632(auVar210));
    auVar225 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar127._12_4_ * fVar272,
                                                  CONCAT48(auVar127._8_4_ * fVar142,
                                                           CONCAT44(auVar127._4_4_ * fVar88,
                                                                    auVar127._0_4_ * fVar111)))),
                               ZEXT1632(auVar118),auVar104);
    auVar98 = vsubps_avx(ZEXT1632(auVar3),ZEXT1632(auVar95));
    auVar104 = vsubps_avx(ZEXT1632(auVar261),ZEXT1632(auVar186));
    auVar140 = vsubps_avx(ZEXT1632(auVar4),ZEXT1632(auVar210));
    auVar12 = vsubps_avx(ZEXT1632(auVar127),ZEXT1632(auVar118));
    local_820._0_4_ = fVar147 * auVar98._0_4_ * 3.0;
    local_820._4_4_ = fVar147 * auVar98._4_4_ * 3.0;
    local_820._8_4_ = fVar147 * auVar98._8_4_ * 3.0;
    local_820._12_4_ = fVar147 * auVar98._12_4_ * 3.0;
    local_820._16_4_ = fVar147 * auVar98._16_4_ * 3.0;
    local_820._20_4_ = fVar147 * auVar98._20_4_ * 3.0;
    local_820._24_4_ = fVar147 * auVar98._24_4_ * 3.0;
    local_820._28_4_ = 0;
    auVar241._0_4_ = fVar147 * auVar104._0_4_ * 3.0;
    auVar241._4_4_ = fVar147 * auVar104._4_4_ * 3.0;
    auVar241._8_4_ = fVar147 * auVar104._8_4_ * 3.0;
    auVar241._12_4_ = fVar147 * auVar104._12_4_ * 3.0;
    auVar241._16_4_ = fVar147 * auVar104._16_4_ * 3.0;
    auVar241._20_4_ = fVar147 * auVar104._20_4_ * 3.0;
    auVar241._24_4_ = fVar147 * auVar104._24_4_ * 3.0;
    local_940._28_4_ = 0;
    local_940._0_28_ = auVar241;
    local_880._0_4_ = fVar147 * auVar140._0_4_ * 3.0;
    local_880._4_4_ = fVar147 * auVar140._4_4_ * 3.0;
    local_880._8_4_ = fVar147 * auVar140._8_4_ * 3.0;
    local_880._12_4_ = fVar147 * auVar140._12_4_ * 3.0;
    local_880._16_4_ = fVar147 * auVar140._16_4_ * 3.0;
    local_880._20_4_ = fVar147 * auVar140._20_4_ * 3.0;
    local_880._24_4_ = fVar147 * auVar140._24_4_ * 3.0;
    local_880._28_4_ = 0;
    fVar111 = fVar147 * auVar12._0_4_ * 3.0;
    fVar142 = fVar147 * auVar12._4_4_ * 3.0;
    auVar21._4_4_ = fVar142;
    auVar21._0_4_ = fVar111;
    fVar143 = fVar147 * auVar12._8_4_ * 3.0;
    auVar21._8_4_ = fVar143;
    fVar144 = fVar147 * auVar12._12_4_ * 3.0;
    auVar21._12_4_ = fVar144;
    fVar145 = fVar147 * auVar12._16_4_ * 3.0;
    auVar21._16_4_ = fVar145;
    fVar146 = fVar147 * auVar12._20_4_ * 3.0;
    auVar21._20_4_ = fVar146;
    fVar147 = fVar147 * auVar12._24_4_ * 3.0;
    auVar21._24_4_ = fVar147;
    auVar21._28_4_ = auVar98._28_4_;
    local_ac0 = ZEXT1632(auVar151);
    local_aa0 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar151));
    _local_920 = vpermps_avx2(_DAT_0205d4a0,local_ae0);
    _local_800 = vpermps_avx2(_DAT_0205d4a0,ZEXT1632(auVar89));
    local_680 = vsubps_avx(local_aa0,local_ac0);
    _local_580 = vsubps_avx(_local_800,ZEXT1632(auVar89));
    fVar160 = local_580._0_4_;
    fVar161 = local_580._4_4_;
    auVar22._4_4_ = fVar161 * local_820._4_4_;
    auVar22._0_4_ = fVar160 * (float)local_820._0_4_;
    fVar162 = local_580._8_4_;
    auVar22._8_4_ = fVar162 * local_820._8_4_;
    fVar163 = local_580._12_4_;
    auVar22._12_4_ = fVar163 * local_820._12_4_;
    fVar203 = local_580._16_4_;
    auVar22._16_4_ = fVar203 * local_820._16_4_;
    fVar204 = local_580._20_4_;
    auVar22._20_4_ = fVar204 * local_820._20_4_;
    fVar233 = local_580._24_4_;
    auVar22._24_4_ = fVar233 * local_820._24_4_;
    auVar22._28_4_ = local_800._28_4_;
    auVar95 = vfmsub231ps_fma(auVar22,local_880,local_680);
    _local_6a0 = vsubps_avx(_local_920,local_ae0);
    fVar252 = local_680._0_4_;
    fVar270 = local_680._4_4_;
    auVar23._4_4_ = fVar270 * auVar241._4_4_;
    auVar23._0_4_ = fVar252 * auVar241._0_4_;
    fVar271 = local_680._8_4_;
    auVar23._8_4_ = fVar271 * auVar241._8_4_;
    fVar273 = local_680._12_4_;
    auVar23._12_4_ = fVar273 * auVar241._12_4_;
    fVar274 = local_680._16_4_;
    auVar23._16_4_ = fVar274 * auVar241._16_4_;
    fVar276 = local_680._20_4_;
    auVar23._20_4_ = fVar276 * auVar241._20_4_;
    fVar277 = local_680._24_4_;
    auVar23._24_4_ = fVar277 * auVar241._24_4_;
    auVar23._28_4_ = local_aa0._28_4_;
    auVar186 = vfmsub231ps_fma(auVar23,local_820,_local_6a0);
    auVar95 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar186._12_4_ * auVar186._12_4_,
                                                 CONCAT48(auVar186._8_4_ * auVar186._8_4_,
                                                          CONCAT44(auVar186._4_4_ * auVar186._4_4_,
                                                                   auVar186._0_4_ * auVar186._0_4_))
                                                )),ZEXT1632(auVar95),ZEXT1632(auVar95));
    fVar184 = local_6a0._0_4_;
    fVar199 = local_6a0._4_4_;
    auVar24._4_4_ = fVar199 * local_880._4_4_;
    auVar24._0_4_ = fVar184 * local_880._0_4_;
    fVar200 = local_6a0._8_4_;
    auVar24._8_4_ = fVar200 * local_880._8_4_;
    fVar201 = local_6a0._12_4_;
    auVar24._12_4_ = fVar201 * local_880._12_4_;
    fVar202 = local_6a0._16_4_;
    auVar24._16_4_ = fVar202 * local_880._16_4_;
    fVar250 = local_6a0._20_4_;
    auVar24._20_4_ = fVar250 * local_880._20_4_;
    fVar251 = local_6a0._24_4_;
    auVar24._24_4_ = fVar251 * local_880._24_4_;
    auVar24._28_4_ = local_920._28_4_;
    auVar210 = vfmsub231ps_fma(auVar24,local_940,_local_580);
    auVar177._0_4_ = fVar160 * fVar160;
    auVar177._4_4_ = fVar161 * fVar161;
    auVar177._8_4_ = fVar162 * fVar162;
    auVar177._12_4_ = fVar163 * fVar163;
    auVar177._16_4_ = fVar203 * fVar203;
    auVar177._20_4_ = fVar204 * fVar204;
    auVar177._24_4_ = fVar233 * fVar233;
    auVar177._28_4_ = 0;
    auVar186 = vfmadd231ps_fma(auVar177,_local_6a0,_local_6a0);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),local_680,local_680);
    auVar104 = vrcpps_avx(ZEXT1632(auVar186));
    auVar210 = vfmadd231ps_fma(ZEXT1632(auVar95),ZEXT1632(auVar210),ZEXT1632(auVar210));
    auVar258._8_4_ = 0x3f800000;
    auVar258._0_8_ = &DAT_3f8000003f800000;
    auVar258._12_4_ = 0x3f800000;
    auVar258._16_4_ = 0x3f800000;
    auVar258._20_4_ = 0x3f800000;
    auVar258._24_4_ = 0x3f800000;
    auVar258._28_4_ = 0x3f800000;
    auVar95 = vfnmadd213ps_fma(auVar104,ZEXT1632(auVar186),auVar258);
    auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar104,auVar104);
    local_8a0 = vpermps_avx2(_DAT_0205d4a0,local_820);
    local_960 = vpermps_avx2(_DAT_0205d4a0,local_880);
    auVar25._4_4_ = local_8a0._4_4_ * fVar161;
    auVar25._0_4_ = local_8a0._0_4_ * fVar160;
    auVar25._8_4_ = local_8a0._8_4_ * fVar162;
    auVar25._12_4_ = local_8a0._12_4_ * fVar163;
    auVar25._16_4_ = local_8a0._16_4_ * fVar203;
    auVar25._20_4_ = local_8a0._20_4_ * fVar204;
    auVar25._24_4_ = local_8a0._24_4_ * fVar233;
    auVar25._28_4_ = auVar104._28_4_;
    auVar118 = vfmsub231ps_fma(auVar25,local_960,local_680);
    local_840 = vpermps_avx2(_DAT_0205d4a0,local_940);
    auVar26._4_4_ = fVar270 * local_840._4_4_;
    auVar26._0_4_ = fVar252 * local_840._0_4_;
    auVar26._8_4_ = fVar271 * local_840._8_4_;
    auVar26._12_4_ = fVar273 * local_840._12_4_;
    auVar26._16_4_ = fVar274 * local_840._16_4_;
    auVar26._20_4_ = fVar276 * local_840._20_4_;
    auVar26._24_4_ = fVar277 * local_840._24_4_;
    auVar26._28_4_ = 0;
    auVar3 = vfmsub231ps_fma(auVar26,local_8a0,_local_6a0);
    auVar118 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar3._12_4_ * auVar3._12_4_,
                                                  CONCAT48(auVar3._8_4_ * auVar3._8_4_,
                                                           CONCAT44(auVar3._4_4_ * auVar3._4_4_,
                                                                    auVar3._0_4_ * auVar3._0_4_)))),
                               ZEXT1632(auVar118),ZEXT1632(auVar118));
    fVar88 = local_960._0_4_;
    auVar213._0_4_ = fVar184 * fVar88;
    fVar272 = local_960._4_4_;
    auVar213._4_4_ = fVar199 * fVar272;
    fVar275 = local_960._8_4_;
    auVar213._8_4_ = fVar200 * fVar275;
    fVar278 = local_960._12_4_;
    auVar213._12_4_ = fVar201 * fVar278;
    fVar8 = local_960._16_4_;
    auVar213._16_4_ = fVar202 * fVar8;
    fVar9 = local_960._20_4_;
    auVar213._20_4_ = fVar250 * fVar9;
    fVar10 = local_960._24_4_;
    auVar213._24_4_ = fVar251 * fVar10;
    auVar213._28_4_ = 0;
    auVar13 = local_840;
    auVar3 = vfmsub231ps_fma(auVar213,local_840,_local_580);
    auVar118 = vfmadd231ps_fma(ZEXT1632(auVar118),ZEXT1632(auVar3),ZEXT1632(auVar3));
    auVar104 = vmaxps_avx(ZEXT1632(CONCAT412(auVar210._12_4_ * auVar95._12_4_,
                                             CONCAT48(auVar210._8_4_ * auVar95._8_4_,
                                                      CONCAT44(auVar210._4_4_ * auVar95._4_4_,
                                                               auVar210._0_4_ * auVar95._0_4_)))),
                          ZEXT1632(CONCAT412(auVar118._12_4_ * auVar95._12_4_,
                                             CONCAT48(auVar118._8_4_ * auVar95._8_4_,
                                                      CONCAT44(auVar118._4_4_ * auVar95._4_4_,
                                                               auVar118._0_4_ * auVar95._0_4_)))));
    local_8e0._0_4_ = auVar225._0_4_ + fVar111;
    local_8e0._4_4_ = auVar225._4_4_ + fVar142;
    local_8e0._8_4_ = auVar225._8_4_ + fVar143;
    local_8e0._12_4_ = auVar225._12_4_ + fVar144;
    local_8e0._16_4_ = fVar145 + 0.0;
    local_8e0._20_4_ = fVar146 + 0.0;
    local_8e0._24_4_ = fVar147 + 0.0;
    local_8e0._28_4_ = auVar98._28_4_ + 0.0;
    local_8c0 = ZEXT1632(auVar225);
    auVar98 = vsubps_avx(local_8c0,auVar21);
    _local_900 = vpermps_avx2(_DAT_0205d4a0,auVar98);
    local_6e0 = vpermps_avx2(_DAT_0205d4a0,local_8c0);
    auVar98 = vmaxps_avx(local_8c0,local_8e0);
    auVar140 = vmaxps_avx(_local_900,local_6e0);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar186));
    auVar98 = vmaxps_avx(auVar98,auVar140);
    fVar111 = auVar12._0_4_;
    fVar142 = auVar12._4_4_;
    fVar147 = auVar12._8_4_;
    fVar143 = auVar12._12_4_;
    fVar144 = auVar12._16_4_;
    fVar145 = auVar12._20_4_;
    fVar146 = auVar12._24_4_;
    auVar27._4_4_ = fVar142 * fVar142 * fVar142 * auVar186._4_4_ * -0.5;
    auVar27._0_4_ = fVar111 * fVar111 * fVar111 * auVar186._0_4_ * -0.5;
    auVar27._8_4_ = fVar147 * fVar147 * fVar147 * auVar186._8_4_ * -0.5;
    auVar27._12_4_ = fVar143 * fVar143 * fVar143 * auVar186._12_4_ * -0.5;
    auVar27._16_4_ = fVar144 * fVar144 * fVar144 * -0.0;
    auVar27._20_4_ = fVar145 * fVar145 * fVar145 * -0.0;
    auVar27._24_4_ = fVar146 * fVar146 * fVar146 * -0.0;
    auVar27._28_4_ = local_840._28_4_;
    auVar99._8_4_ = 0x3fc00000;
    auVar99._0_8_ = 0x3fc000003fc00000;
    auVar99._12_4_ = 0x3fc00000;
    auVar99._16_4_ = 0x3fc00000;
    auVar99._20_4_ = 0x3fc00000;
    auVar99._24_4_ = 0x3fc00000;
    auVar99._28_4_ = 0x3fc00000;
    auVar95 = vfmadd231ps_fma(auVar27,auVar99,auVar12);
    auVar244 = ZEXT1664(auVar95);
    fVar142 = auVar95._0_4_;
    fVar147 = auVar95._4_4_;
    auVar28._4_4_ = fVar199 * fVar147;
    auVar28._0_4_ = fVar184 * fVar142;
    fVar144 = auVar95._8_4_;
    auVar28._8_4_ = fVar200 * fVar144;
    fVar146 = auVar95._12_4_;
    auVar28._12_4_ = fVar201 * fVar146;
    auVar28._16_4_ = fVar202 * 0.0;
    auVar28._20_4_ = fVar250 * 0.0;
    auVar28._24_4_ = fVar251 * 0.0;
    auVar28._28_4_ = 0;
    auVar29._4_4_ = fStack_63c * fVar147 * fVar161;
    auVar29._0_4_ = local_640 * fVar142 * fVar160;
    auVar29._8_4_ = fStack_638 * fVar144 * fVar162;
    auVar29._12_4_ = fStack_634 * fVar146 * fVar163;
    auVar29._16_4_ = fStack_630 * fVar203 * 0.0;
    auVar29._20_4_ = fStack_62c * fVar204 * 0.0;
    auVar29._24_4_ = fStack_628 * fVar233 * 0.0;
    auVar29._28_4_ = local_6a0._28_4_;
    auVar95 = vfmadd231ps_fma(auVar29,auVar28,_local_620);
    local_660 = ZEXT1632(auVar89);
    auVar154 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar140 = vsubps_avx(auVar154,local_660);
    fVar184 = auVar140._0_4_;
    auVar262._0_4_ = fVar184 * fVar142 * fVar160;
    fVar199 = auVar140._4_4_;
    auVar262._4_4_ = fVar199 * fVar147 * fVar161;
    fVar200 = auVar140._8_4_;
    auVar262._8_4_ = fVar200 * fVar144 * fVar162;
    fVar201 = auVar140._12_4_;
    auVar262._12_4_ = fVar201 * fVar146 * fVar163;
    fVar202 = auVar140._16_4_;
    auVar262._16_4_ = fVar202 * fVar203 * 0.0;
    fVar203 = auVar140._20_4_;
    auVar262._20_4_ = fVar203 * fVar204 * 0.0;
    fVar204 = auVar140._24_4_;
    auVar262._24_4_ = fVar204 * fVar233 * 0.0;
    auVar262._28_4_ = 0;
    auVar154 = vsubps_avx(auVar154,local_ae0);
    auVar186 = vfmadd231ps_fma(auVar262,auVar154,auVar28);
    auVar30._4_4_ = fVar270 * fVar147;
    auVar30._0_4_ = fVar252 * fVar142;
    auVar30._8_4_ = fVar271 * fVar144;
    auVar30._12_4_ = fVar273 * fVar146;
    auVar30._16_4_ = fVar274 * 0.0;
    auVar30._20_4_ = fVar276 * 0.0;
    auVar30._24_4_ = fVar277 * 0.0;
    auVar30._28_4_ = auVar12._28_4_;
    auVar95 = vfmadd231ps_fma(ZEXT1632(auVar95),auVar30,_local_600);
    auVar248 = ZEXT1664(auVar95);
    auVar179 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar221 = vsubps_avx(auVar179,local_ac0);
    auVar186 = vfmadd231ps_fma(ZEXT1632(auVar186),auVar221,auVar30);
    auVar31._4_4_ = fStack_63c * fVar199;
    auVar31._0_4_ = local_640 * fVar184;
    auVar31._8_4_ = fStack_638 * fVar200;
    auVar31._12_4_ = fStack_634 * fVar201;
    auVar31._16_4_ = fStack_630 * fVar202;
    auVar31._20_4_ = fStack_62c * fVar203;
    auVar31._24_4_ = fStack_628 * fVar204;
    auVar31._28_4_ = auVar12._28_4_;
    auVar210 = vfmadd231ps_fma(auVar31,_local_620,auVar154);
    auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),_local_600,auVar221);
    fVar111 = auVar186._0_4_;
    fVar233 = auVar95._0_4_;
    fVar143 = auVar186._4_4_;
    fVar250 = auVar95._4_4_;
    fVar145 = auVar186._8_4_;
    fVar251 = auVar95._8_4_;
    fVar160 = auVar186._12_4_;
    fVar252 = auVar95._12_4_;
    auVar32._28_4_ = local_600._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(fVar252 * fVar160,
                            CONCAT48(fVar251 * fVar145,CONCAT44(fVar250 * fVar143,fVar233 * fVar111)
                                    )));
    auVar12 = vsubps_avx(ZEXT1632(auVar210),auVar32);
    auVar33._4_4_ = fVar199 * fVar199;
    auVar33._0_4_ = fVar184 * fVar184;
    auVar33._8_4_ = fVar200 * fVar200;
    auVar33._12_4_ = fVar201 * fVar201;
    auVar33._16_4_ = fVar202 * fVar202;
    auVar33._20_4_ = fVar203 * fVar203;
    auVar33._24_4_ = fVar204 * fVar204;
    auVar33._28_4_ = local_600._28_4_;
    auVar210 = vfmadd231ps_fma(auVar33,auVar154,auVar154);
    auVar210 = vfmadd231ps_fma(ZEXT1632(auVar210),auVar221,auVar221);
    auVar34._28_4_ = fStack_624;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar160 * fVar160,
                            CONCAT48(fVar145 * fVar145,CONCAT44(fVar143 * fVar143,fVar111 * fVar111)
                                    )));
    local_700 = vsubps_avx(ZEXT1632(auVar210),auVar34);
    local_740 = vsqrtps_avx(auVar104);
    fVar111 = (auVar98._0_4_ + local_740._0_4_) * 1.0000002;
    fVar143 = (auVar98._4_4_ + local_740._4_4_) * 1.0000002;
    fVar145 = (auVar98._8_4_ + local_740._8_4_) * 1.0000002;
    fVar160 = (auVar98._12_4_ + local_740._12_4_) * 1.0000002;
    fVar161 = (auVar98._16_4_ + local_740._16_4_) * 1.0000002;
    fVar162 = (auVar98._20_4_ + local_740._20_4_) * 1.0000002;
    fVar163 = (auVar98._24_4_ + local_740._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar143 * fVar143;
    auVar35._0_4_ = fVar111 * fVar111;
    auVar35._8_4_ = fVar145 * fVar145;
    auVar35._12_4_ = fVar160 * fVar160;
    auVar35._16_4_ = fVar161 * fVar161;
    auVar35._20_4_ = fVar162 * fVar162;
    auVar35._24_4_ = fVar163 * fVar163;
    auVar35._28_4_ = auVar98._28_4_ + local_740._28_4_;
    fVar143 = auVar12._0_4_ + auVar12._0_4_;
    fVar145 = auVar12._4_4_ + auVar12._4_4_;
    local_a40._0_8_ = CONCAT44(fVar145,fVar143);
    local_a40._8_4_ = auVar12._8_4_ + auVar12._8_4_;
    local_a40._12_4_ = auVar12._12_4_ + auVar12._12_4_;
    local_a40._16_4_ = auVar12._16_4_ + auVar12._16_4_;
    local_a40._20_4_ = auVar12._20_4_ + auVar12._20_4_;
    local_a40._24_4_ = auVar12._24_4_ + auVar12._24_4_;
    fVar111 = auVar12._28_4_;
    local_a40._28_4_ = fVar111 + fVar111;
    auVar12 = vsubps_avx(local_700,auVar35);
    auVar246 = ZEXT1632(auVar95);
    local_5a0._28_4_ = auVar98._28_4_;
    local_5a0._0_28_ =
         ZEXT1628(CONCAT412(fVar252 * fVar252,
                            CONCAT48(fVar251 * fVar251,CONCAT44(fVar250 * fVar250,fVar233 * fVar233)
                                    )));
    local_6c0 = vsubps_avx(local_2e0,local_5a0);
    local_720._4_4_ = fVar145 * fVar145;
    local_720._0_4_ = fVar143 * fVar143;
    fStack_718 = local_a40._8_4_ * local_a40._8_4_;
    fStack_714 = local_a40._12_4_ * local_a40._12_4_;
    fStack_710 = local_a40._16_4_ * local_a40._16_4_;
    fStack_70c = local_a40._20_4_ * local_a40._20_4_;
    fStack_708 = local_a40._24_4_ * local_a40._24_4_;
    fStack_704 = fVar111;
    fVar160 = local_6c0._0_4_;
    local_780._0_4_ = fVar160 * 4.0;
    fVar161 = local_6c0._4_4_;
    local_780._4_4_ = fVar161 * 4.0;
    fVar162 = local_6c0._8_4_;
    fStack_778 = fVar162 * 4.0;
    fVar163 = local_6c0._12_4_;
    fStack_774 = fVar163 * 4.0;
    fVar233 = local_6c0._16_4_;
    fStack_770 = fVar233 * 4.0;
    fVar250 = local_6c0._20_4_;
    fStack_76c = fVar250 * 4.0;
    fVar251 = local_6c0._24_4_;
    fStack_768 = fVar251 * 4.0;
    uStack_764 = 0x40800000;
    auVar36._4_4_ = auVar12._4_4_ * (float)local_780._4_4_;
    auVar36._0_4_ = auVar12._0_4_ * (float)local_780._0_4_;
    auVar36._8_4_ = auVar12._8_4_ * fStack_778;
    auVar36._12_4_ = auVar12._12_4_ * fStack_774;
    auVar36._16_4_ = auVar12._16_4_ * fStack_770;
    auVar36._20_4_ = auVar12._20_4_ * fStack_76c;
    auVar36._24_4_ = auVar12._24_4_ * fStack_768;
    auVar36._28_4_ = 0x40800000;
    auVar98 = vsubps_avx(_local_720,auVar36);
    auVar104 = vcmpps_avx(auVar98,auVar179,5);
    auVar263 = ZEXT1632(auVar186);
    fVar111 = local_6c0._28_4_;
    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar104 >> 0x7f,0) == '\0') &&
          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar104 >> 0xbf,0) == '\0') &&
        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar104[0x1f])
    {
      auVar253._8_4_ = 0x7f800000;
      auVar253._0_8_ = 0x7f8000007f800000;
      auVar253._12_4_ = 0x7f800000;
      auVar253._16_4_ = 0x7f800000;
      auVar253._20_4_ = 0x7f800000;
      auVar253._24_4_ = 0x7f800000;
      auVar253._28_4_ = 0x7f800000;
      auVar230._8_4_ = 0xff800000;
      auVar230._0_8_ = 0xff800000ff800000;
      auVar230._12_4_ = 0xff800000;
      auVar230._16_4_ = 0xff800000;
      auVar230._20_4_ = 0xff800000;
      auVar230._24_4_ = 0xff800000;
      auVar230._28_4_ = 0xff800000;
    }
    else {
      auVar130 = vsqrtps_avx(auVar98);
      auVar254._0_4_ = fVar160 + fVar160;
      auVar254._4_4_ = fVar161 + fVar161;
      auVar254._8_4_ = fVar162 + fVar162;
      auVar254._12_4_ = fVar163 + fVar163;
      auVar254._16_4_ = fVar233 + fVar233;
      auVar254._20_4_ = fVar250 + fVar250;
      auVar254._24_4_ = fVar251 + fVar251;
      auVar254._28_4_ = fVar111 + fVar111;
      auVar11 = vrcpps_avx(auVar254);
      auVar98 = vcmpps_avx(auVar98,auVar179,5);
      auVar100._8_4_ = 0x3f800000;
      auVar100._0_8_ = &DAT_3f8000003f800000;
      auVar100._12_4_ = 0x3f800000;
      auVar100._16_4_ = 0x3f800000;
      auVar100._20_4_ = 0x3f800000;
      auVar100._24_4_ = 0x3f800000;
      auVar100._28_4_ = 0x3f800000;
      auVar95 = vfnmadd213ps_fma(auVar254,auVar11,auVar100);
      auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar11,auVar11);
      auVar101._0_8_ = CONCAT44(fVar145,fVar143) ^ 0x8000000080000000;
      auVar101._8_4_ = -local_a40._8_4_;
      auVar101._12_4_ = -local_a40._12_4_;
      auVar101._16_4_ = -local_a40._16_4_;
      auVar101._20_4_ = -local_a40._20_4_;
      auVar101._24_4_ = -local_a40._24_4_;
      auVar101._28_4_ = -local_a40._28_4_;
      auVar179 = vsubps_avx(auVar101,auVar130);
      auVar37._4_4_ = auVar95._4_4_ * auVar179._4_4_;
      auVar37._0_4_ = auVar95._0_4_ * auVar179._0_4_;
      auVar37._8_4_ = auVar95._8_4_ * auVar179._8_4_;
      auVar37._12_4_ = auVar95._12_4_ * auVar179._12_4_;
      auVar37._16_4_ = auVar179._16_4_ * 0.0;
      auVar37._20_4_ = auVar179._20_4_ * 0.0;
      auVar37._24_4_ = auVar179._24_4_ * 0.0;
      auVar37._28_4_ = auVar179._28_4_;
      auVar179 = vsubps_avx(auVar130,local_a40);
      auVar38._4_4_ = auVar95._4_4_ * auVar179._4_4_;
      auVar38._0_4_ = auVar95._0_4_ * auVar179._0_4_;
      auVar38._8_4_ = auVar95._8_4_ * auVar179._8_4_;
      auVar38._12_4_ = auVar95._12_4_ * auVar179._12_4_;
      auVar38._16_4_ = auVar179._16_4_ * 0.0;
      auVar38._20_4_ = auVar179._20_4_ * 0.0;
      auVar38._24_4_ = auVar179._24_4_ * 0.0;
      auVar38._28_4_ = auVar11._28_4_;
      auVar95 = vfmadd213ps_fma(auVar246,auVar37,auVar263);
      local_540 = ZEXT1632(CONCAT412(fVar146 * auVar95._12_4_,
                                     CONCAT48(fVar144 * auVar95._8_4_,
                                              CONCAT44(fVar147 * auVar95._4_4_,
                                                       fVar142 * auVar95._0_4_))));
      auVar95 = vfmadd213ps_fma(auVar246,auVar38,auVar263);
      local_560 = ZEXT1632(CONCAT412(fVar146 * auVar95._12_4_,
                                     CONCAT48(fVar144 * auVar95._8_4_,
                                              CONCAT44(fVar147 * auVar95._4_4_,
                                                       fVar142 * auVar95._0_4_))));
      auVar220._8_4_ = 0x7f800000;
      auVar220._0_8_ = 0x7f8000007f800000;
      auVar220._12_4_ = 0x7f800000;
      auVar220._16_4_ = 0x7f800000;
      auVar220._20_4_ = 0x7f800000;
      auVar220._24_4_ = 0x7f800000;
      auVar220._28_4_ = 0x7f800000;
      auVar253 = vblendvps_avx(auVar220,auVar37,auVar98);
      auVar179 = vandps_avx(local_5a0,local_7a0);
      auVar179 = vmaxps_avx(local_480,auVar179);
      auVar39._4_4_ = auVar179._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar179._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar179._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar179._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar179._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar179._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar179._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar179._28_4_;
      auVar179 = vandps_avx(local_6c0,local_7a0);
      auVar179 = vcmpps_avx(auVar179,auVar39,1);
      auVar102._8_4_ = 0xff800000;
      auVar102._0_8_ = 0xff800000ff800000;
      auVar102._12_4_ = 0xff800000;
      auVar102._16_4_ = 0xff800000;
      auVar102._20_4_ = 0xff800000;
      auVar102._24_4_ = 0xff800000;
      auVar102._28_4_ = 0xff800000;
      auVar230 = vblendvps_avx(auVar102,auVar38,auVar98);
      auVar11 = auVar98 & auVar179;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar104 = vandps_avx(auVar179,auVar98);
        auVar179 = vcmpps_avx(auVar12,_DAT_02020f00,2);
        auVar259._8_4_ = 0xff800000;
        auVar259._0_8_ = 0xff800000ff800000;
        auVar259._12_4_ = 0xff800000;
        auVar259._16_4_ = 0xff800000;
        auVar259._20_4_ = 0xff800000;
        auVar259._24_4_ = 0xff800000;
        auVar259._28_4_ = 0xff800000;
        auVar286._8_4_ = 0x7f800000;
        auVar286._0_8_ = 0x7f8000007f800000;
        auVar286._12_4_ = 0x7f800000;
        auVar286._16_4_ = 0x7f800000;
        auVar286._20_4_ = 0x7f800000;
        auVar286._24_4_ = 0x7f800000;
        auVar286._28_4_ = 0x7f800000;
        auVar12 = vblendvps_avx(auVar286,auVar259,auVar179);
        auVar95 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar11 = vpmovsxwd_avx2(auVar95);
        auVar253 = vblendvps_avx(auVar253,auVar12,auVar11);
        auVar12 = vblendvps_avx(auVar259,auVar286,auVar179);
        auVar230 = vblendvps_avx(auVar230,auVar12,auVar11);
        auVar108._0_8_ = auVar104._0_8_ ^ 0xffffffffffffffff;
        auVar108._8_4_ = auVar104._8_4_ ^ 0xffffffff;
        auVar108._12_4_ = auVar104._12_4_ ^ 0xffffffff;
        auVar108._16_4_ = auVar104._16_4_ ^ 0xffffffff;
        auVar108._20_4_ = auVar104._20_4_ ^ 0xffffffff;
        auVar108._24_4_ = auVar104._24_4_ ^ 0xffffffff;
        auVar108._28_4_ = auVar104._28_4_ ^ 0xffffffff;
        auVar104 = vorps_avx(auVar179,auVar108);
        auVar104 = vandps_avx(auVar98,auVar104);
      }
    }
    auVar256 = ZEXT3264(auVar253);
    auVar232 = ZEXT3264(auVar230);
    auVar239 = ZEXT3264(local_a40);
    auVar218 = ZEXT3264(auVar98);
    auVar98 = local_380 & auVar104;
    if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar98 >> 0x7f,0) != '\0') ||
          (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar98 >> 0xbf,0) != '\0') ||
        (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar98[0x1f] < '\0')
    {
      fVar143 = (ray->super_RayK<1>).org.field_0.m128[3] - (float)local_7d0._0_4_;
      auVar103._4_4_ = fVar143;
      auVar103._0_4_ = fVar143;
      auVar103._8_4_ = fVar143;
      auVar103._12_4_ = fVar143;
      auVar103._16_4_ = fVar143;
      auVar103._20_4_ = fVar143;
      auVar103._24_4_ = fVar143;
      auVar103._28_4_ = fVar143;
      auVar12 = vmaxps_avx(auVar103,auVar253);
      fVar143 = (ray->super_RayK<1>).tfar - (float)local_7d0._0_4_;
      auVar214._4_4_ = fVar143;
      auVar214._0_4_ = fVar143;
      auVar214._8_4_ = fVar143;
      auVar214._12_4_ = fVar143;
      auVar214._16_4_ = fVar143;
      auVar214._20_4_ = fVar143;
      auVar214._24_4_ = fVar143;
      auVar214._28_4_ = fVar143;
      auVar40._4_4_ = fVar199 * local_880._4_4_;
      auVar40._0_4_ = fVar184 * local_880._0_4_;
      auVar40._8_4_ = fVar200 * local_880._8_4_;
      auVar40._12_4_ = fVar201 * local_880._12_4_;
      auVar40._16_4_ = fVar202 * local_880._16_4_;
      auVar40._20_4_ = fVar203 * local_880._20_4_;
      auVar40._24_4_ = fVar204 * local_880._24_4_;
      auVar40._28_4_ = auVar140._28_4_;
      auVar95 = vfmadd213ps_fma(auVar154,local_940,auVar40);
      auVar186 = vfmadd213ps_fma(auVar221,local_820,ZEXT1632(auVar95));
      auVar41._4_4_ = local_880._4_4_ * fStack_63c;
      auVar41._0_4_ = local_880._0_4_ * local_640;
      auVar41._8_4_ = local_880._8_4_ * fStack_638;
      auVar41._12_4_ = local_880._12_4_ * fStack_634;
      auVar41._16_4_ = local_880._16_4_ * fStack_630;
      auVar41._20_4_ = local_880._20_4_ * fStack_62c;
      auVar41._24_4_ = local_880._24_4_ * fStack_628;
      auVar41._28_4_ = 0;
      auVar95 = vfmadd231ps_fma(auVar41,local_940,_local_620);
      auVar210 = vfmadd231ps_fma(ZEXT1632(auVar95),local_820,_local_600);
      auVar98 = vandps_avx(ZEXT1632(auVar210),local_7a0);
      auVar269._8_4_ = 0x219392ef;
      auVar269._0_8_ = 0x219392ef219392ef;
      auVar269._12_4_ = 0x219392ef;
      auVar269._16_4_ = 0x219392ef;
      auVar269._20_4_ = 0x219392ef;
      auVar269._24_4_ = 0x219392ef;
      auVar269._28_4_ = 0x219392ef;
      auVar140 = vcmpps_avx(auVar98,auVar269,1);
      auVar98 = vrcpps_avx(ZEXT1632(auVar210));
      auVar282._8_4_ = 0x3f800000;
      auVar282._0_8_ = &DAT_3f8000003f800000;
      auVar282._12_4_ = 0x3f800000;
      auVar282._16_4_ = 0x3f800000;
      auVar282._20_4_ = 0x3f800000;
      auVar282._24_4_ = 0x3f800000;
      auVar282._28_4_ = 0x3f800000;
      auVar221 = ZEXT1632(auVar210);
      auVar95 = vfnmadd213ps_fma(auVar98,auVar221,auVar282);
      auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar98,auVar98);
      auVar178._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
      auVar178._8_4_ = auVar210._8_4_ ^ 0x80000000;
      auVar178._12_4_ = auVar210._12_4_ ^ 0x80000000;
      auVar178._16_4_ = 0x80000000;
      auVar178._20_4_ = 0x80000000;
      auVar178._24_4_ = 0x80000000;
      auVar178._28_4_ = 0x80000000;
      auVar255._0_4_ = auVar95._0_4_ * -auVar186._0_4_;
      auVar255._4_4_ = auVar95._4_4_ * -auVar186._4_4_;
      auVar255._8_4_ = auVar95._8_4_ * -auVar186._8_4_;
      auVar255._12_4_ = auVar95._12_4_ * -auVar186._12_4_;
      auVar255._16_4_ = 0x80000000;
      auVar255._20_4_ = 0x80000000;
      auVar255._24_4_ = 0x80000000;
      auVar255._28_4_ = 0;
      auVar98 = vcmpps_avx(auVar221,auVar178,1);
      auVar98 = vorps_avx(auVar140,auVar98);
      auVar283._8_4_ = 0xff800000;
      auVar283._0_8_ = 0xff800000ff800000;
      auVar283._12_4_ = 0xff800000;
      auVar283._16_4_ = 0xff800000;
      auVar283._20_4_ = 0xff800000;
      auVar283._24_4_ = 0xff800000;
      auVar283._28_4_ = 0xff800000;
      auVar98 = vblendvps_avx(auVar255,auVar283,auVar98);
      auVar154 = vminps_avx(auVar214,auVar230);
      auVar12 = vmaxps_avx(auVar12,auVar98);
      auVar98 = vcmpps_avx(auVar221,auVar178,6);
      auVar98 = vorps_avx(auVar140,auVar98);
      auVar284._8_4_ = 0x7f800000;
      auVar284._0_8_ = 0x7f8000007f800000;
      auVar284._12_4_ = 0x7f800000;
      auVar284._16_4_ = 0x7f800000;
      auVar284._20_4_ = 0x7f800000;
      auVar284._24_4_ = 0x7f800000;
      auVar284._28_4_ = 0x7f800000;
      auVar98 = vblendvps_avx(auVar255,auVar284,auVar98);
      auVar154 = vminps_avx(auVar154,auVar98);
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,_local_920);
      auVar140 = vsubps_avx(ZEXT832(0) << 0x20,_local_800);
      auVar42._4_4_ = auVar140._4_4_ * fVar272;
      auVar42._0_4_ = auVar140._0_4_ * fVar88;
      auVar42._8_4_ = auVar140._8_4_ * fVar275;
      auVar42._12_4_ = auVar140._12_4_ * fVar278;
      auVar42._16_4_ = auVar140._16_4_ * fVar8;
      auVar42._20_4_ = auVar140._20_4_ * fVar9;
      auVar42._24_4_ = auVar140._24_4_ * fVar10;
      auVar42._28_4_ = auVar140._28_4_;
      auVar239 = ZEXT3264(local_840);
      auVar95 = vfnmsub231ps_fma(auVar42,local_840,auVar98);
      auVar98 = vsubps_avx(ZEXT832(0) << 0x20,local_aa0);
      auVar186 = vfnmadd231ps_fma(ZEXT1632(auVar95),local_8a0,auVar98);
      auVar43._4_4_ = fVar272 * fStack_63c;
      auVar43._0_4_ = fVar88 * local_640;
      auVar43._8_4_ = fVar275 * fStack_638;
      auVar43._12_4_ = fVar278 * fStack_634;
      auVar43._16_4_ = fVar8 * fStack_630;
      auVar43._20_4_ = fVar9 * fStack_62c;
      auVar43._24_4_ = fVar10 * fStack_628;
      auVar43._28_4_ = auVar98._28_4_;
      auVar95 = vfnmsub231ps_fma(auVar43,local_840,_local_620);
      auVar210 = vfnmadd231ps_fma(ZEXT1632(auVar95),local_8a0,_local_600);
      auVar98 = vandps_avx(ZEXT1632(auVar210),local_7a0);
      auVar221 = vrcpps_avx(ZEXT1632(auVar210));
      auVar191._8_4_ = 0x219392ef;
      auVar191._0_8_ = 0x219392ef219392ef;
      auVar191._12_4_ = 0x219392ef;
      auVar191._16_4_ = 0x219392ef;
      auVar191._20_4_ = 0x219392ef;
      auVar191._24_4_ = 0x219392ef;
      auVar191._28_4_ = 0x219392ef;
      auVar140 = vcmpps_avx(auVar98,auVar191,1);
      auVar192._8_4_ = 0x3f800000;
      auVar192._0_8_ = &DAT_3f8000003f800000;
      auVar192._12_4_ = 0x3f800000;
      auVar192._16_4_ = 0x3f800000;
      auVar192._20_4_ = 0x3f800000;
      auVar192._24_4_ = 0x3f800000;
      auVar192._28_4_ = 0x3f800000;
      auVar179 = ZEXT1632(auVar210);
      auVar95 = vfnmadd213ps_fma(auVar221,auVar179,auVar192);
      auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar221,auVar221);
      auVar231._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
      auVar231._8_4_ = auVar210._8_4_ ^ 0x80000000;
      auVar231._12_4_ = auVar210._12_4_ ^ 0x80000000;
      auVar231._16_4_ = 0x80000000;
      auVar231._20_4_ = 0x80000000;
      auVar231._24_4_ = 0x80000000;
      auVar231._28_4_ = 0x80000000;
      auVar232 = ZEXT3264(auVar231);
      auVar44._4_4_ = auVar95._4_4_ * -auVar186._4_4_;
      auVar44._0_4_ = auVar95._0_4_ * -auVar186._0_4_;
      auVar44._8_4_ = auVar95._8_4_ * -auVar186._8_4_;
      auVar44._12_4_ = auVar95._12_4_ * -auVar186._12_4_;
      auVar44._16_4_ = 0x80000000;
      auVar44._20_4_ = 0x80000000;
      auVar44._24_4_ = 0x80000000;
      auVar44._28_4_ = 0x80000000;
      auVar218 = ZEXT3264(auVar44);
      auVar98 = vcmpps_avx(auVar179,auVar231,1);
      auVar98 = vorps_avx(auVar98,auVar140);
      auVar193._8_4_ = 0xff800000;
      auVar193._0_8_ = 0xff800000ff800000;
      auVar193._12_4_ = 0xff800000;
      auVar193._16_4_ = 0xff800000;
      auVar193._20_4_ = 0xff800000;
      auVar193._24_4_ = 0xff800000;
      auVar193._28_4_ = 0xff800000;
      auVar98 = vblendvps_avx(auVar44,auVar193,auVar98);
      auVar256 = ZEXT3264(auVar98);
      local_9a0 = vmaxps_avx(auVar12,auVar98);
      auVar98 = vcmpps_avx(auVar179,auVar231,6);
      auVar98 = vorps_avx(auVar140,auVar98);
      auVar98 = vblendvps_avx(auVar44,auVar284,auVar98);
      auVar104 = vandps_avx(local_380,auVar104);
      local_500 = vminps_avx(auVar154,auVar98);
      auVar98 = vcmpps_avx(local_9a0,local_500,2);
      auVar140 = auVar104 & auVar98;
      if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar140 >> 0x7f,0) != '\0') ||
            (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar140 >> 0xbf,0) != '\0') ||
          (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar140[0x1f] < '\0') {
        auVar194._8_4_ = 0x3f800000;
        auVar194._0_8_ = &DAT_3f8000003f800000;
        auVar194._12_4_ = 0x3f800000;
        auVar194._16_4_ = 0x3f800000;
        auVar194._20_4_ = 0x3f800000;
        auVar194._24_4_ = 0x3f800000;
        auVar194._28_4_ = 0x3f800000;
        auVar140 = vminps_avx(local_540,auVar194);
        auVar154 = ZEXT1232(ZEXT812(0)) << 0x20;
        auVar140 = vmaxps_avx(auVar140,auVar154);
        auVar12 = vminps_avx(local_560,auVar194);
        auVar12 = vmaxps_avx(auVar12,auVar154);
        auVar45._4_4_ = (auVar140._4_4_ + 1.0) * 0.125;
        auVar45._0_4_ = (auVar140._0_4_ + 0.0) * 0.125;
        auVar45._8_4_ = (auVar140._8_4_ + 2.0) * 0.125;
        auVar45._12_4_ = (auVar140._12_4_ + 3.0) * 0.125;
        auVar45._16_4_ = (auVar140._16_4_ + 4.0) * 0.125;
        auVar45._20_4_ = (auVar140._20_4_ + 5.0) * 0.125;
        auVar45._24_4_ = (auVar140._24_4_ + 6.0) * 0.125;
        auVar45._28_4_ = auVar140._28_4_ + 7.0;
        auVar95 = vfmadd213ps_fma(auVar45,local_860,local_980);
        auVar46._4_4_ = (auVar12._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar12._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar12._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar12._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar12._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar12._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar12._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar12._28_4_ + 7.0;
        auVar186 = vfmadd213ps_fma(auVar46,local_860,local_980);
        auVar140 = vminps_avx(local_8c0,local_8e0);
        auVar12 = vminps_avx(_local_900,local_6e0);
        auVar140 = vminps_avx(auVar140,auVar12);
        auVar140 = vsubps_avx(auVar140,local_740);
        auVar104 = vandps_avx(auVar98,auVar104);
        local_540 = ZEXT1632(auVar95);
        local_560 = ZEXT1632(auVar186);
        auVar47._4_4_ = auVar140._4_4_ * 0.99999976;
        auVar47._0_4_ = auVar140._0_4_ * 0.99999976;
        auVar47._8_4_ = auVar140._8_4_ * 0.99999976;
        auVar47._12_4_ = auVar140._12_4_ * 0.99999976;
        auVar47._16_4_ = auVar140._16_4_ * 0.99999976;
        auVar47._20_4_ = auVar140._20_4_ * 0.99999976;
        auVar47._24_4_ = auVar140._24_4_ * 0.99999976;
        auVar47._28_4_ = 0x3f7ffffc;
        auVar98 = vmaxps_avx(ZEXT832(0) << 0x20,auVar47);
        auVar48._4_4_ = auVar98._4_4_ * auVar98._4_4_;
        auVar48._0_4_ = auVar98._0_4_ * auVar98._0_4_;
        auVar48._8_4_ = auVar98._8_4_ * auVar98._8_4_;
        auVar48._12_4_ = auVar98._12_4_ * auVar98._12_4_;
        auVar48._16_4_ = auVar98._16_4_ * auVar98._16_4_;
        auVar48._20_4_ = auVar98._20_4_ * auVar98._20_4_;
        auVar48._24_4_ = auVar98._24_4_ * auVar98._24_4_;
        auVar48._28_4_ = auVar98._28_4_;
        auVar140 = vsubps_avx(local_700,auVar48);
        auVar49._4_4_ = auVar140._4_4_ * (float)local_780._4_4_;
        auVar49._0_4_ = auVar140._0_4_ * (float)local_780._0_4_;
        auVar49._8_4_ = auVar140._8_4_ * fStack_778;
        auVar49._12_4_ = auVar140._12_4_ * fStack_774;
        auVar49._16_4_ = auVar140._16_4_ * fStack_770;
        auVar49._20_4_ = auVar140._20_4_ * fStack_76c;
        auVar49._24_4_ = auVar140._24_4_ * fStack_768;
        auVar49._28_4_ = auVar98._28_4_;
        auVar12 = vsubps_avx(_local_720,auVar49);
        auVar59 = ZEXT412(0);
        auVar154 = ZEXT1232(auVar59) << 0x20;
        local_4a0 = ZEXT1232(auVar59) << 0x20;
        auVar98 = vcmpps_avx(auVar12,ZEXT1232(ZEXT812(0)) << 0x20,5);
        auVar239 = ZEXT3264(auVar98);
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar98 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar98 >> 0x7f,0) == '\0') &&
              (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar98 >> 0xbf,0) == '\0') &&
            (auVar98 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar98[0x1f]) {
          local_680 = ZEXT1232(auVar59) << 0x20;
          _local_6a0 = ZEXT1232(auVar59) << 0x20;
          auVar179 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar190 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar215._8_4_ = 0x7f800000;
          auVar215._0_8_ = 0x7f8000007f800000;
          auVar215._12_4_ = 0x7f800000;
          auVar215._16_4_ = 0x7f800000;
          auVar215._20_4_ = 0x7f800000;
          auVar215._24_4_ = 0x7f800000;
          auVar215._28_4_ = 0x7f800000;
          auVar222._8_4_ = 0xff800000;
          auVar222._0_8_ = 0xff800000ff800000;
          auVar222._12_4_ = 0xff800000;
          auVar222._16_4_ = 0xff800000;
          auVar222._20_4_ = 0xff800000;
          auVar222._24_4_ = 0xff800000;
          auVar222._28_4_ = 0xff800000;
        }
        else {
          local_aa0 = auVar98;
          auVar155._0_4_ = fVar160 + fVar160;
          auVar155._4_4_ = fVar161 + fVar161;
          auVar155._8_4_ = fVar162 + fVar162;
          auVar155._12_4_ = fVar163 + fVar163;
          auVar155._16_4_ = fVar233 + fVar233;
          auVar155._20_4_ = fVar250 + fVar250;
          auVar155._24_4_ = fVar251 + fVar251;
          auVar155._28_4_ = fVar111 + fVar111;
          auVar154 = vrcpps_avx(auVar155);
          auVar195._8_4_ = 0x3f800000;
          auVar195._0_8_ = &DAT_3f8000003f800000;
          auVar195._12_4_ = 0x3f800000;
          auVar195._16_4_ = 0x3f800000;
          auVar195._20_4_ = 0x3f800000;
          auVar195._24_4_ = 0x3f800000;
          auVar195._28_4_ = 0x3f800000;
          auVar95 = vfnmadd213ps_fma(auVar155,auVar154,auVar195);
          auVar95 = vfmadd132ps_fma(ZEXT1632(auVar95),auVar154,auVar154);
          auVar154 = vsqrtps_avx(auVar12);
          auVar196._0_8_ = local_a40._0_8_ ^ 0x8000000080000000;
          auVar196._8_4_ = -local_a40._8_4_;
          auVar196._12_4_ = -local_a40._12_4_;
          auVar196._16_4_ = -local_a40._16_4_;
          auVar196._20_4_ = -local_a40._20_4_;
          auVar196._24_4_ = -local_a40._24_4_;
          auVar196._28_4_ = -local_a40._28_4_;
          auVar221 = vsubps_avx(auVar196,auVar154);
          auVar154 = vsubps_avx(auVar154,local_a40);
          auVar285._0_4_ = auVar221._0_4_ * auVar95._0_4_;
          auVar285._4_4_ = auVar221._4_4_ * auVar95._4_4_;
          auVar285._8_4_ = auVar221._8_4_ * auVar95._8_4_;
          auVar285._12_4_ = auVar221._12_4_ * auVar95._12_4_;
          auVar285._16_4_ = auVar221._16_4_ * 0.0;
          auVar285._20_4_ = auVar221._20_4_ * 0.0;
          auVar285._24_4_ = auVar221._24_4_ * 0.0;
          auVar285._28_4_ = 0;
          fVar111 = auVar154._0_4_ * auVar95._0_4_;
          fVar88 = auVar154._4_4_ * auVar95._4_4_;
          auVar50._4_4_ = fVar88;
          auVar50._0_4_ = fVar111;
          fVar272 = auVar154._8_4_ * auVar95._8_4_;
          auVar50._8_4_ = fVar272;
          fVar143 = auVar154._12_4_ * auVar95._12_4_;
          auVar50._12_4_ = fVar143;
          fVar275 = auVar154._16_4_ * 0.0;
          auVar50._16_4_ = fVar275;
          fVar145 = auVar154._20_4_ * 0.0;
          auVar50._20_4_ = fVar145;
          fVar278 = auVar154._24_4_ * 0.0;
          auVar50._24_4_ = fVar278;
          auVar50._28_4_ = 0x80000000;
          auVar95 = vfmadd213ps_fma(auVar246,auVar285,auVar263);
          auVar186 = vfmadd213ps_fma(auVar246,auVar50,auVar263);
          auVar51._28_4_ = auVar221._28_4_;
          auVar51._0_28_ =
               ZEXT1628(CONCAT412(fVar146 * auVar95._12_4_,
                                  CONCAT48(fVar144 * auVar95._8_4_,
                                           CONCAT44(fVar147 * auVar95._4_4_,fVar142 * auVar95._0_4_)
                                          )));
          auVar154 = ZEXT1632(CONCAT412(fVar146 * auVar186._12_4_,
                                        CONCAT48(fVar144 * auVar186._8_4_,
                                                 CONCAT44(fVar147 * auVar186._4_4_,
                                                          fVar142 * auVar186._0_4_))));
          auVar95 = vfmadd213ps_fma(local_680,auVar51,local_ac0);
          auVar186 = vfmadd213ps_fma(local_680,auVar154,local_ac0);
          auVar210 = vfmadd213ps_fma(_local_6a0,auVar51,local_ae0);
          auVar118 = vfmadd213ps_fma(_local_6a0,auVar154,local_ae0);
          auVar3 = vfmadd213ps_fma(auVar51,_local_580,local_660);
          auVar261 = vfmadd213ps_fma(_local_580,auVar154,local_660);
          auVar52._4_4_ = auVar285._4_4_ * (float)local_600._4_4_;
          auVar52._0_4_ = auVar285._0_4_ * (float)local_600._0_4_;
          auVar52._8_4_ = auVar285._8_4_ * fStack_5f8;
          auVar52._12_4_ = auVar285._12_4_ * fStack_5f4;
          auVar52._16_4_ = auVar285._16_4_ * fStack_5f0;
          auVar52._20_4_ = auVar285._20_4_ * fStack_5ec;
          auVar52._24_4_ = auVar285._24_4_ * fStack_5e8;
          auVar52._28_4_ = 0;
          auVar154 = vsubps_avx(auVar52,ZEXT1632(auVar95));
          auVar180._0_4_ = auVar285._0_4_ * (float)local_620._0_4_;
          auVar180._4_4_ = auVar285._4_4_ * (float)local_620._4_4_;
          auVar180._8_4_ = auVar285._8_4_ * fStack_618;
          auVar180._12_4_ = auVar285._12_4_ * fStack_614;
          auVar180._16_4_ = auVar285._16_4_ * fStack_610;
          auVar180._20_4_ = auVar285._20_4_ * fStack_60c;
          auVar180._24_4_ = auVar285._24_4_ * fStack_608;
          auVar180._28_4_ = 0;
          auVar179 = vsubps_avx(auVar180,ZEXT1632(auVar210));
          auVar216._0_4_ = local_640 * auVar285._0_4_;
          auVar216._4_4_ = fStack_63c * auVar285._4_4_;
          auVar216._8_4_ = fStack_638 * auVar285._8_4_;
          auVar216._12_4_ = fStack_634 * auVar285._12_4_;
          auVar216._16_4_ = fStack_630 * auVar285._16_4_;
          auVar216._20_4_ = fStack_62c * auVar285._20_4_;
          auVar216._24_4_ = fStack_628 * auVar285._24_4_;
          auVar216._28_4_ = 0;
          auVar221 = vsubps_avx(auVar216,ZEXT1632(auVar3));
          auVar190 = auVar221._0_28_;
          auVar53._4_4_ = fVar88 * (float)local_600._4_4_;
          auVar53._0_4_ = fVar111 * (float)local_600._0_4_;
          auVar53._8_4_ = fVar272 * fStack_5f8;
          auVar53._12_4_ = fVar143 * fStack_5f4;
          auVar53._16_4_ = fVar275 * fStack_5f0;
          auVar53._20_4_ = fVar145 * fStack_5ec;
          auVar53._24_4_ = fVar278 * fStack_5e8;
          auVar53._28_4_ = 0;
          local_4a0 = vsubps_avx(auVar53,ZEXT1632(auVar186));
          auVar54._4_4_ = fVar88 * (float)local_620._4_4_;
          auVar54._0_4_ = fVar111 * (float)local_620._0_4_;
          auVar54._8_4_ = fVar272 * fStack_618;
          auVar54._12_4_ = fVar143 * fStack_614;
          auVar54._16_4_ = fVar275 * fStack_610;
          auVar54._20_4_ = fVar145 * fStack_60c;
          auVar54._24_4_ = fVar278 * fStack_608;
          auVar54._28_4_ = local_4a0._28_4_;
          local_680 = vsubps_avx(auVar54,ZEXT1632(auVar118));
          auVar55._4_4_ = fStack_63c * fVar88;
          auVar55._0_4_ = local_640 * fVar111;
          auVar55._8_4_ = fStack_638 * fVar272;
          auVar55._12_4_ = fStack_634 * fVar143;
          auVar55._16_4_ = fStack_630 * fVar275;
          auVar55._20_4_ = fStack_62c * fVar145;
          auVar55._24_4_ = fStack_628 * fVar278;
          auVar55._28_4_ = local_680._28_4_;
          _local_6a0 = vsubps_avx(auVar55,ZEXT1632(auVar261));
          auVar221 = vcmpps_avx(auVar12,_DAT_02020f00,5);
          auVar217._8_4_ = 0x7f800000;
          auVar217._0_8_ = 0x7f8000007f800000;
          auVar217._12_4_ = 0x7f800000;
          auVar217._16_4_ = 0x7f800000;
          auVar217._20_4_ = 0x7f800000;
          auVar217._24_4_ = 0x7f800000;
          auVar217._28_4_ = 0x7f800000;
          auVar215 = vblendvps_avx(auVar217,auVar285,auVar221);
          auVar12 = vandps_avx(local_7a0,local_5a0);
          auVar12 = vmaxps_avx(local_480,auVar12);
          auVar56._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar56._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar56._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar56._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar56._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar56._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar56._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar56._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(local_7a0,local_6c0);
          auVar12 = vcmpps_avx(auVar12,auVar56,1);
          auVar223._8_4_ = 0xff800000;
          auVar223._0_8_ = 0xff800000ff800000;
          auVar223._12_4_ = 0xff800000;
          auVar223._16_4_ = 0xff800000;
          auVar223._20_4_ = 0xff800000;
          auVar223._24_4_ = 0xff800000;
          auVar223._28_4_ = 0xff800000;
          auVar222 = vblendvps_avx(auVar223,auVar50,auVar221);
          auVar246 = auVar221 & auVar12;
          if ((((((((auVar246 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar246 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar246 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar246 >> 0x7f,0) == '\0') &&
                (auVar246 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar246 >> 0xbf,0) == '\0') &&
              (auVar246 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar246[0x1f]) {
            auVar239 = ZEXT3264(auVar98);
          }
          else {
            auVar98 = vandps_avx(auVar12,auVar221);
            auVar12 = vcmpps_avx(auVar140,ZEXT832(0) << 0x20,2);
            auVar260._8_4_ = 0xff800000;
            auVar260._0_8_ = 0xff800000ff800000;
            auVar260._12_4_ = 0xff800000;
            auVar260._16_4_ = 0xff800000;
            auVar260._20_4_ = 0xff800000;
            auVar260._24_4_ = 0xff800000;
            auVar260._28_4_ = 0xff800000;
            auVar264._8_4_ = 0x7f800000;
            auVar264._0_8_ = 0x7f8000007f800000;
            auVar264._12_4_ = 0x7f800000;
            auVar264._16_4_ = 0x7f800000;
            auVar264._20_4_ = 0x7f800000;
            auVar264._24_4_ = 0x7f800000;
            auVar264._28_4_ = 0x7f800000;
            auVar140 = vblendvps_avx(auVar264,auVar260,auVar12);
            auVar95 = vpackssdw_avx(auVar98._0_16_,auVar98._16_16_);
            auVar246 = vpmovsxwd_avx2(auVar95);
            auVar215 = vblendvps_avx(auVar215,auVar140,auVar246);
            auVar140 = vblendvps_avx(auVar260,auVar264,auVar12);
            auVar222 = vblendvps_avx(auVar222,auVar140,auVar246);
            auVar238._0_8_ = auVar98._0_8_ ^ 0xffffffffffffffff;
            auVar238._8_4_ = auVar98._8_4_ ^ 0xffffffff;
            auVar238._12_4_ = auVar98._12_4_ ^ 0xffffffff;
            auVar238._16_4_ = auVar98._16_4_ ^ 0xffffffff;
            auVar238._20_4_ = auVar98._20_4_ ^ 0xffffffff;
            auVar238._24_4_ = auVar98._24_4_ ^ 0xffffffff;
            auVar238._28_4_ = auVar98._28_4_ ^ 0xffffffff;
            auVar98 = vorps_avx(auVar12,auVar238);
            auVar98 = vandps_avx(auVar98,auVar221);
            auVar239 = ZEXT3264(auVar98);
          }
        }
        uVar84 = *(undefined4 *)&(ray->super_RayK<1>).dir.field_0;
        auVar243._4_4_ = uVar84;
        auVar243._0_4_ = uVar84;
        auVar243._8_4_ = uVar84;
        auVar243._12_4_ = uVar84;
        auVar243._16_4_ = uVar84;
        auVar243._20_4_ = uVar84;
        auVar243._24_4_ = uVar84;
        auVar243._28_4_ = uVar84;
        auVar244 = ZEXT3264(auVar243);
        uVar84 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 4);
        auVar247._4_4_ = uVar84;
        auVar247._0_4_ = uVar84;
        auVar247._8_4_ = uVar84;
        auVar247._12_4_ = uVar84;
        auVar247._16_4_ = uVar84;
        auVar247._20_4_ = uVar84;
        auVar247._24_4_ = uVar84;
        auVar247._28_4_ = uVar84;
        auVar248 = ZEXT3264(auVar247);
        fVar111 = (ray->super_RayK<1>).dir.field_0.m128[2];
        local_4e0 = local_9a0;
        local_4c0 = vminps_avx(local_500,auVar215);
        _local_520 = vmaxps_avx(local_9a0,auVar222);
        auVar256 = ZEXT3264(_local_520);
        auVar98 = vcmpps_avx(local_9a0,local_4c0,2);
        local_5a0 = vandps_avx(auVar98,auVar104);
        auVar218 = ZEXT3264(local_5a0);
        local_5c0 = local_5a0;
        auVar98 = vcmpps_avx(_local_520,local_500,2);
        local_5e0 = vandps_avx(auVar98,auVar104);
        auVar232 = ZEXT3264(local_5e0);
        auVar104 = vorps_avx(local_5e0,local_5a0);
        if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0x7f,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar104 >> 0xbf,0) != '\0') ||
            (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar104[0x1f] < '\0') {
          auVar198 = ZEXT3264(local_9a0);
          local_3e0 = local_5e0;
          _local_3c0 = _local_520;
          local_400._0_8_ = auVar239._0_8_ ^ 0xffffffffffffffff;
          local_400._8_4_ = auVar239._8_4_ ^ 0xffffffff;
          local_400._12_4_ = auVar239._12_4_ ^ 0xffffffff;
          local_400._16_4_ = auVar239._16_4_ ^ 0xffffffff;
          local_400._20_4_ = auVar239._20_4_ ^ 0xffffffff;
          local_400._24_4_ = auVar239._24_4_ ^ 0xffffffff;
          local_400._28_4_ = auVar239._28_4_ ^ 0xffffffff;
          auVar218 = ZEXT3264(local_400);
          auVar57._4_4_ = fVar111 * auVar190._4_4_;
          auVar57._0_4_ = fVar111 * auVar190._0_4_;
          auVar57._8_4_ = fVar111 * auVar190._8_4_;
          auVar57._12_4_ = fVar111 * auVar190._12_4_;
          auVar57._16_4_ = fVar111 * auVar190._16_4_;
          auVar57._20_4_ = fVar111 * auVar190._20_4_;
          auVar57._24_4_ = fVar111 * auVar190._24_4_;
          auVar57._28_4_ = auVar104._28_4_;
          auVar256 = ZEXT3264(auVar247);
          auVar95 = vfmadd213ps_fma(auVar179,auVar247,auVar57);
          auVar248 = ZEXT3264(auVar243);
          auVar95 = vfmadd213ps_fma(auVar154,auVar243,ZEXT1632(auVar95));
          auVar104 = vandps_avx(ZEXT1632(auVar95),local_7a0);
          auVar131._8_4_ = 0x3e99999a;
          auVar131._0_8_ = 0x3e99999a3e99999a;
          auVar131._12_4_ = 0x3e99999a;
          auVar131._16_4_ = 0x3e99999a;
          auVar131._20_4_ = 0x3e99999a;
          auVar131._24_4_ = 0x3e99999a;
          auVar131._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar131,1);
          auVar104 = vorps_avx(auVar104,local_400);
          auVar132._8_4_ = 3;
          auVar132._0_8_ = 0x300000003;
          auVar132._12_4_ = 3;
          auVar132._16_4_ = 3;
          auVar132._20_4_ = 3;
          auVar132._24_4_ = 3;
          auVar132._28_4_ = 3;
          auVar156._8_4_ = 2;
          auVar156._0_8_ = 0x200000002;
          auVar156._12_4_ = 2;
          auVar156._16_4_ = 2;
          auVar156._20_4_ = 2;
          auVar156._24_4_ = 2;
          auVar156._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar156,auVar132,auVar104);
          uVar84 = (undefined4)uVar85;
          local_420._4_4_ = uVar84;
          local_420._0_4_ = uVar84;
          local_420._8_4_ = uVar84;
          local_420._12_4_ = uVar84;
          local_420._16_4_ = uVar84;
          local_420._20_4_ = uVar84;
          local_420._24_4_ = uVar84;
          local_420._28_4_ = uVar84;
          local_6c0 = vpcmpgtd_avx2(auVar104,local_420);
          local_5c0 = vpandn_avx2(local_6c0,local_5a0);
          auVar183 = ZEXT3264(local_5c0);
          auVar104 = local_5a0 & ~local_6c0;
          local_660 = ZEXT1632(CONCAT88(auVar89._8_8_,uVar85));
          fVar88 = fVar111;
          fVar142 = fVar111;
          fVar272 = fVar111;
          fVar147 = fVar111;
          fVar143 = fVar111;
          fVar275 = fVar111;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            auVar186 = vminps_avx(local_9e0,local_a00);
            auVar95 = vmaxps_avx(local_9e0,local_a00);
            auVar210 = vminps_avx(local_9f0,_local_a10);
            auVar118 = vminps_avx(auVar186,auVar210);
            auVar186 = vmaxps_avx(local_9f0,_local_a10);
            auVar210 = vmaxps_avx(auVar95,auVar186);
            local_6e0._8_4_ = 0x7fffffff;
            local_6e0._0_8_ = 0x7fffffff7fffffff;
            local_6e0._12_4_ = 0x7fffffff;
            auVar95 = vandps_avx(auVar118,local_6e0._0_16_);
            auVar186 = vandps_avx(auVar210,local_6e0._0_16_);
            auVar95 = vmaxps_avx(auVar95,auVar186);
            auVar186 = vmovshdup_avx(auVar95);
            auVar186 = vmaxss_avx(auVar186,auVar95);
            auVar95 = vshufpd_avx(auVar95,auVar95,1);
            auVar95 = vmaxss_avx(auVar95,auVar186);
            local_940._4_24_ = auVar241._4_24_;
            local_940._0_4_ = auVar95._0_4_ * 1.9073486e-06;
            local_940._28_4_ = 0;
            auVar95 = vshufps_avx(auVar210,auVar210,0xff);
            _local_780 = auVar95;
            local_580._4_4_ = local_9a0._4_4_ + (float)local_760._4_4_;
            local_580._0_4_ = local_9a0._0_4_ + (float)local_760._0_4_;
            fStack_578 = local_9a0._8_4_ + fStack_758;
            fStack_574 = local_9a0._12_4_ + fStack_754;
            fStack_570 = local_9a0._16_4_ + fStack_750;
            fStack_56c = local_9a0._20_4_ + fStack_74c;
            fStack_568 = local_9a0._24_4_ + fStack_748;
            fStack_564 = local_9a0._28_4_ + fStack_744;
            local_8c0 = auVar243;
            local_8e0 = auVar247;
            local_900._4_4_ = fVar111;
            local_900._0_4_ = fVar111;
            fStack_8f8 = fVar111;
            fStack_8f4 = fVar111;
            fStack_8f0 = fVar111;
            fStack_8ec = fVar111;
            fStack_8e8 = fVar111;
            fStack_8e4 = fVar111;
            local_840 = auVar13;
            do {
              auVar133._8_4_ = 0x7f800000;
              auVar133._0_8_ = 0x7f8000007f800000;
              auVar133._12_4_ = 0x7f800000;
              auVar133._16_4_ = 0x7f800000;
              auVar133._20_4_ = 0x7f800000;
              auVar133._24_4_ = 0x7f800000;
              auVar133._28_4_ = 0x7f800000;
              auVar104 = auVar183._0_32_;
              auVar98 = vblendvps_avx(auVar133,auVar198._0_32_,auVar104);
              auVar140 = vshufps_avx(auVar98,auVar98,0xb1);
              auVar140 = vminps_avx(auVar98,auVar140);
              auVar12 = vshufpd_avx(auVar140,auVar140,5);
              auVar140 = vminps_avx(auVar140,auVar12);
              auVar12 = vpermpd_avx2(auVar140,0x4e);
              auVar140 = vminps_avx(auVar140,auVar12);
              auVar98 = vcmpps_avx(auVar98,auVar140,0);
              auVar140 = auVar104 & auVar98;
              if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar140 >> 0x7f,0) != '\0') ||
                    (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar140 >> 0xbf,0) != '\0') ||
                  (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar140[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar98,auVar104);
              }
              uVar80 = vmovmskps_avx(auVar104);
              iVar14 = 0;
              for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar80 = iVar14 << 2;
              *(undefined4 *)(local_5c0 + uVar80) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              local_820._0_16_ = (undefined1  [16])aVar1;
              auVar95 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              auVar239 = ZEXT464(*(uint *)(local_540 + uVar80));
              if (auVar95._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_540 + uVar80));
                local_ac0._0_16_ = ZEXT416((uint)*(float *)(local_4e0 + uVar80));
                fVar111 = sqrtf(auVar95._0_4_);
                auVar239 = ZEXT1664(local_ae0._0_16_);
                fVar144 = (float)local_ac0._0_4_;
                uVar84 = local_ac0._4_4_;
                uVar265 = local_ac0._8_4_;
                uVar266 = local_ac0._12_4_;
              }
              else {
                auVar95 = vsqrtss_avx(auVar95,auVar95);
                fVar111 = auVar95._0_4_;
                fVar144 = *(float *)(local_4e0 + uVar80);
                uVar84 = 0;
                uVar265 = 0;
                uVar266 = 0;
              }
              local_860._0_4_ = fVar111 * 1.9073486e-06;
              lVar86 = 4;
              do {
                auVar104 = local_ac0;
                fVar88 = auVar239._0_4_;
                fVar111 = 1.0 - fVar88;
                auVar112._0_4_ = local_a00._0_4_ * fVar88;
                auVar112._4_4_ = local_a00._4_4_ * fVar88;
                auVar112._8_4_ = local_a00._8_4_ * fVar88;
                auVar112._12_4_ = local_a00._12_4_ * fVar88;
                auVar148._4_4_ = fVar111;
                auVar148._0_4_ = fVar111;
                auVar148._8_4_ = fVar111;
                auVar148._12_4_ = fVar111;
                auVar95 = vfmadd231ps_fma(auVar112,auVar148,local_9e0);
                auVar164._0_4_ = local_9f0._0_4_ * fVar88;
                auVar164._4_4_ = local_9f0._4_4_ * fVar88;
                auVar164._8_4_ = local_9f0._8_4_ * fVar88;
                auVar164._12_4_ = local_9f0._12_4_ * fVar88;
                auVar186 = vfmadd231ps_fma(auVar164,auVar148,local_a00);
                auVar207._0_4_ = fVar88 * auVar186._0_4_;
                auVar207._4_4_ = fVar88 * auVar186._4_4_;
                auVar207._8_4_ = fVar88 * auVar186._8_4_;
                auVar207._12_4_ = fVar88 * auVar186._12_4_;
                local_880._0_16_ = vfmadd231ps_fma(auVar207,auVar148,auVar95);
                auVar113._0_4_ = fVar88 * (float)local_a10._0_4_;
                auVar113._4_4_ = fVar88 * (float)local_a10._4_4_;
                auVar113._8_4_ = fVar88 * fStack_a08;
                auVar113._12_4_ = fVar88 * fStack_a04;
                auVar95 = vfmadd231ps_fma(auVar113,auVar148,local_9f0);
                auVar185._0_4_ = fVar88 * auVar95._0_4_;
                auVar185._4_4_ = fVar88 * auVar95._4_4_;
                auVar185._8_4_ = fVar88 * auVar95._8_4_;
                auVar185._12_4_ = fVar88 * auVar95._12_4_;
                auVar186 = vfmadd231ps_fma(auVar185,auVar148,auVar186);
                auVar114._4_4_ = fVar144;
                auVar114._0_4_ = fVar144;
                auVar114._8_4_ = fVar144;
                auVar114._12_4_ = fVar144;
                auVar95 = vfmadd213ps_fma(auVar114,local_820._0_16_,_DAT_01feba10);
                auVar91._0_4_ = fVar88 * auVar186._0_4_;
                auVar91._4_4_ = fVar88 * auVar186._4_4_;
                auVar91._8_4_ = fVar88 * auVar186._8_4_;
                auVar91._12_4_ = fVar88 * auVar186._12_4_;
                auVar210 = vfmadd231ps_fma(auVar91,local_880._0_16_,auVar148);
                local_8a0._0_16_ = auVar210;
                auVar95 = vsubps_avx(auVar95,auVar210);
                _local_800 = auVar95;
                auVar95 = vdpps_avx(auVar95,auVar95,0x7f);
                local_ae0._0_16_ = auVar239._0_16_;
                local_ac0._4_4_ = uVar84;
                local_ac0._0_4_ = fVar144;
                local_ac0._8_4_ = uVar265;
                local_ac0._16_16_ = auVar104._16_16_;
                local_ac0._12_4_ = uVar266;
                local_aa0._0_16_ = auVar95;
                if (auVar95._0_4_ < 0.0) {
                  _local_920 = ZEXT416((uint)fVar111);
                  local_960._0_16_ = auVar186;
                  auVar198._0_4_ = sqrtf(auVar95._0_4_);
                  auVar198._4_60_ = extraout_var;
                  auVar95 = auVar198._0_16_;
                  auVar186 = local_960._0_16_;
                  auVar210 = local_ae0._0_16_;
                  auVar118 = _local_920;
                  fVar144 = (float)local_ac0._0_4_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  auVar210 = auVar239._0_16_;
                  auVar118 = ZEXT416((uint)fVar111);
                }
                auVar186 = vsubps_avx(auVar186,local_880._0_16_);
                local_880._0_4_ = auVar186._0_4_ * 3.0;
                local_880._4_4_ = auVar186._4_4_ * 3.0;
                local_880._8_4_ = auVar186._8_4_ * 3.0;
                local_880._12_4_ = auVar186._12_4_ * 3.0;
                auVar186 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar118,auVar210);
                auVar3 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar210,auVar118);
                fVar111 = auVar118._0_4_ * 6.0;
                fVar88 = auVar186._0_4_ * 6.0;
                fVar142 = auVar3._0_4_ * 6.0;
                fVar272 = auVar210._0_4_ * 6.0;
                auVar165._0_4_ = fVar272 * (float)local_a10._0_4_;
                auVar165._4_4_ = fVar272 * (float)local_a10._4_4_;
                auVar165._8_4_ = fVar272 * fStack_a08;
                auVar165._12_4_ = fVar272 * fStack_a04;
                auVar115._4_4_ = fVar142;
                auVar115._0_4_ = fVar142;
                auVar115._8_4_ = fVar142;
                auVar115._12_4_ = fVar142;
                auVar186 = vfmadd132ps_fma(auVar115,auVar165,local_9f0);
                auVar166._4_4_ = fVar88;
                auVar166._0_4_ = fVar88;
                auVar166._8_4_ = fVar88;
                auVar166._12_4_ = fVar88;
                auVar186 = vfmadd132ps_fma(auVar166,auVar186,local_a00);
                auVar210 = vdpps_avx(local_880._0_16_,local_880._0_16_,0x7f);
                auVar116._4_4_ = fVar111;
                auVar116._0_4_ = fVar111;
                auVar116._8_4_ = fVar111;
                auVar116._12_4_ = fVar111;
                auVar3 = vfmadd132ps_fma(auVar116,auVar186,local_9e0);
                auVar186 = vblendps_avx(auVar210,_DAT_01feba10,0xe);
                auVar118 = vrsqrtss_avx(auVar186,auVar186);
                fVar142 = auVar210._0_4_;
                fVar111 = auVar118._0_4_;
                auVar118 = vdpps_avx(local_880._0_16_,auVar3,0x7f);
                fVar111 = fVar111 * 1.5 + fVar142 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar117._0_4_ = auVar3._0_4_ * fVar142;
                auVar117._4_4_ = auVar3._4_4_ * fVar142;
                auVar117._8_4_ = auVar3._8_4_ * fVar142;
                auVar117._12_4_ = auVar3._12_4_ * fVar142;
                fVar88 = auVar118._0_4_;
                auVar208._0_4_ = local_880._0_4_ * fVar88;
                auVar208._4_4_ = local_880._4_4_ * fVar88;
                auVar208._8_4_ = local_880._8_4_ * fVar88;
                auVar208._12_4_ = local_880._12_4_ * fVar88;
                auVar118 = vsubps_avx(auVar117,auVar208);
                auVar186 = vrcpss_avx(auVar186,auVar186);
                auVar3 = vfnmadd213ss_fma(auVar186,auVar210,ZEXT416(0x40000000));
                fVar88 = auVar186._0_4_ * auVar3._0_4_;
                auVar186 = vmaxss_avx(ZEXT416((uint)local_940._0_4_),
                                      ZEXT416((uint)(fVar144 * (float)local_860._0_4_)));
                local_920._0_4_ = auVar186._0_4_;
                uVar85 = CONCAT44(local_880._4_4_,local_880._0_4_);
                auVar234._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar234._8_4_ = -local_880._8_4_;
                auVar234._12_4_ = -local_880._12_4_;
                local_980._0_4_ = fVar111 * auVar118._0_4_ * fVar88;
                local_980._4_4_ = fVar111 * auVar118._4_4_ * fVar88;
                local_980._8_4_ = fVar111 * auVar118._8_4_ * fVar88;
                local_980._12_4_ = fVar111 * auVar118._12_4_ * fVar88;
                local_a40._0_4_ = local_880._0_4_ * fVar111;
                local_a40._4_4_ = local_880._4_4_ * fVar111;
                local_a40._8_4_ = local_880._8_4_ * fVar111;
                local_a40._12_4_ = local_880._12_4_ * fVar111;
                if (fVar142 < -fVar142) {
                  local_960._0_4_ = auVar95._0_4_;
                  local_840._0_16_ = auVar234;
                  fVar111 = sqrtf(fVar142);
                  auVar95 = ZEXT416((uint)local_960._0_4_);
                  auVar234 = local_840._0_16_;
                }
                else {
                  auVar186 = vsqrtss_avx(auVar210,auVar210);
                  fVar111 = auVar186._0_4_;
                }
                local_960._0_16_ = vdpps_avx(_local_800,local_a40._0_16_,0x7f);
                auVar3 = vfmadd213ss_fma(ZEXT416((uint)local_940._0_4_),auVar95,
                                         ZEXT416((uint)local_920._0_4_));
                auVar186 = vdpps_avx(auVar234,local_a40._0_16_,0x7f);
                auVar210 = vdpps_avx(_local_800,local_980._0_16_,0x7f);
                auVar118 = vdpps_avx(local_820._0_16_,local_a40._0_16_,0x7f);
                auVar95 = vfmadd213ss_fma(ZEXT416((uint)(auVar95._0_4_ + 1.0)),
                                          ZEXT416((uint)((float)local_940._0_4_ / fVar111)),auVar3);
                local_840._0_4_ = auVar95._0_4_;
                auVar92._0_4_ = local_960._0_4_ * local_960._0_4_;
                auVar92._4_4_ = local_960._4_4_ * local_960._4_4_;
                auVar92._8_4_ = local_960._8_4_ * local_960._8_4_;
                auVar92._12_4_ = local_960._12_4_ * local_960._12_4_;
                auVar95 = vdpps_avx(_local_800,auVar234,0x7f);
                auVar261 = vsubps_avx(local_aa0._0_16_,auVar92);
                auVar3 = vrsqrtss_avx(auVar261,auVar261);
                fVar88 = auVar261._0_4_;
                fVar111 = auVar3._0_4_;
                fVar111 = fVar111 * 1.5 + fVar88 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar3 = vdpps_avx(_local_800,local_820._0_16_,0x7f);
                local_a40._0_16_ = ZEXT416((uint)(auVar186._0_4_ + auVar210._0_4_));
                local_980._0_16_ = vfnmadd231ss_fma(auVar95,local_960._0_16_,local_a40._0_16_);
                auVar95 = vfnmadd231ss_fma(auVar3,local_960._0_16_,auVar118);
                if (fVar88 < 0.0) {
                  local_700._0_16_ = auVar118;
                  local_720._0_4_ = fVar111;
                  local_740._0_16_ = auVar95;
                  fVar88 = sqrtf(fVar88);
                  fVar111 = (float)local_720._0_4_;
                  auVar95 = local_740._0_16_;
                  auVar118 = local_700._0_16_;
                }
                else {
                  auVar186 = vsqrtss_avx(auVar261,auVar261);
                  fVar88 = auVar186._0_4_;
                }
                auVar198 = ZEXT3264(local_9a0);
                auVar248 = ZEXT3264(local_8c0);
                auVar256 = ZEXT3264(local_8e0);
                auVar186 = vpermilps_avx(local_8a0._0_16_,0xff);
                auVar3 = vshufps_avx(local_880._0_16_,local_880._0_16_,0xff);
                auVar210 = vfmsub213ss_fma(local_980._0_16_,ZEXT416((uint)fVar111),auVar3);
                auVar167._0_8_ = auVar118._0_8_ ^ 0x8000000080000000;
                auVar167._8_4_ = auVar118._8_4_ ^ 0x80000000;
                auVar167._12_4_ = auVar118._12_4_ ^ 0x80000000;
                auVar187._0_8_ = auVar210._0_8_ ^ 0x8000000080000000;
                auVar187._8_4_ = auVar210._8_4_ ^ 0x80000000;
                auVar187._12_4_ = auVar210._12_4_ ^ 0x80000000;
                auVar232 = ZEXT1664(local_a40._0_16_);
                auVar95 = ZEXT416((uint)(auVar95._0_4_ * fVar111));
                auVar210 = vfmsub231ss_fma(ZEXT416((uint)(auVar118._0_4_ * auVar210._0_4_)),
                                           local_a40._0_16_,auVar95);
                auVar95 = vinsertps_avx(auVar95,auVar167,0x10);
                uVar84 = auVar210._0_4_;
                auVar168._4_4_ = uVar84;
                auVar168._0_4_ = uVar84;
                auVar168._8_4_ = uVar84;
                auVar168._12_4_ = uVar84;
                auVar95 = vdivps_avx(auVar95,auVar168);
                auVar244 = ZEXT1664(local_960._0_16_);
                auVar118 = ZEXT416((uint)(fVar88 - auVar186._0_4_));
                auVar210 = vinsertps_avx(local_960._0_16_,auVar118,0x10);
                auVar218 = ZEXT1664(auVar210);
                auVar149._0_4_ = auVar210._0_4_ * auVar95._0_4_;
                auVar149._4_4_ = auVar210._4_4_ * auVar95._4_4_;
                auVar149._8_4_ = auVar210._8_4_ * auVar95._8_4_;
                auVar149._12_4_ = auVar210._12_4_ * auVar95._12_4_;
                auVar95 = vinsertps_avx(auVar187,local_a40._0_16_,0x1c);
                auVar95 = vdivps_avx(auVar95,auVar168);
                auVar169._0_4_ = auVar210._0_4_ * auVar95._0_4_;
                auVar169._4_4_ = auVar210._4_4_ * auVar95._4_4_;
                auVar169._8_4_ = auVar210._8_4_ * auVar95._8_4_;
                auVar169._12_4_ = auVar210._12_4_ * auVar95._12_4_;
                auVar95 = vhaddps_avx(auVar149,auVar149);
                auVar186 = vhaddps_avx(auVar169,auVar169);
                fVar145 = (float)local_ae0._0_4_ - auVar95._0_4_;
                auVar239 = ZEXT464((uint)fVar145);
                fVar144 = (float)local_ac0._0_4_ - auVar186._0_4_;
                uVar84 = 0;
                uVar265 = 0;
                uVar266 = 0;
                auVar95 = vandps_avx(local_960._0_16_,local_6e0._0_16_);
                fVar88 = (float)local_900._4_4_;
                fVar142 = fStack_8f8;
                fVar272 = fStack_8f4;
                fVar147 = fStack_8f0;
                fVar143 = fStack_8ec;
                fVar275 = fStack_8e8;
                fVar111 = (float)local_900._0_4_;
                if ((float)local_840._0_4_ <= auVar95._0_4_) {
LAB_018127a3:
                  bVar58 = false;
                }
                else {
                  auVar186 = vfmadd231ss_fma(ZEXT416((uint)((float)local_840._0_4_ +
                                                           (float)local_920._0_4_)),_local_780,
                                             ZEXT416(0x36000000));
                  auVar95 = vandps_avx(auVar118,local_6e0._0_16_);
                  if (auVar186._0_4_ <= auVar95._0_4_) goto LAB_018127a3;
                  fVar144 = fVar144 + (float)local_7d0._0_4_;
                  uVar84 = 0;
                  uVar265 = 0;
                  uVar266 = 0;
                  bVar58 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar144) &&
                       (fVar278 = (ray->super_RayK<1>).tfar, fVar144 <= fVar278)) &&
                      (0.0 <= fVar145)) && (fVar145 <= 1.0)) {
                    auVar95 = vrsqrtss_avx(local_aa0._0_16_,local_aa0._0_16_);
                    fVar146 = auVar95._0_4_;
                    pGVar6 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar146 = fVar146 * 1.5 + local_aa0._0_4_ * -0.5 * fVar146 * fVar146 * fVar146
                      ;
                      auVar119._0_4_ = fVar146 * (float)local_800._0_4_;
                      auVar119._4_4_ = fVar146 * (float)local_800._4_4_;
                      auVar119._8_4_ = fVar146 * fStack_7f8;
                      auVar119._12_4_ = fVar146 * fStack_7f4;
                      auVar3 = vfmadd213ps_fma(auVar3,auVar119,local_880._0_16_);
                      auVar95 = vshufps_avx(auVar119,auVar119,0xc9);
                      auVar186 = vshufps_avx(local_880._0_16_,local_880._0_16_,0xc9);
                      auVar120._0_4_ = auVar119._0_4_ * auVar186._0_4_;
                      auVar120._4_4_ = auVar119._4_4_ * auVar186._4_4_;
                      auVar120._8_4_ = auVar119._8_4_ * auVar186._8_4_;
                      auVar120._12_4_ = auVar119._12_4_ * auVar186._12_4_;
                      auVar118 = vfmsub231ps_fma(auVar120,local_880._0_16_,auVar95);
                      auVar95 = vshufps_avx(auVar118,auVar118,0xc9);
                      auVar186 = vshufps_avx(auVar3,auVar3,0xc9);
                      auVar118 = vshufps_avx(auVar118,auVar118,0xd2);
                      auVar93._0_4_ = auVar3._0_4_ * auVar118._0_4_;
                      auVar93._4_4_ = auVar3._4_4_ * auVar118._4_4_;
                      auVar93._8_4_ = auVar3._8_4_ * auVar118._8_4_;
                      auVar93._12_4_ = auVar3._12_4_ * auVar118._12_4_;
                      auVar95 = vfmsub231ps_fma(auVar93,auVar95,auVar186);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar144;
                        auVar186 = vshufps_avx(auVar95,auVar95,0xe9);
                        uVar224 = vmovlps_avx(auVar186);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar224;
                        (ray->Ng).field_0.field_0.z = auVar95._0_4_;
                        ray->u = fVar145;
                        ray->v = 0.0;
                        ray->primID = uVar82;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar186 = vshufps_avx(auVar95,auVar95,0xe9);
                        local_9d0 = vmovlps_avx(auVar186);
                        local_9c8 = auVar95._0_4_;
                        local_9c4 = fVar145;
                        local_9c0 = 0;
                        local_9bc = uVar82;
                        local_9b8 = (uint)local_ae8;
                        local_9b4 = context->user->instID[0];
                        local_9b0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar144;
                        local_aec = -1;
                        local_a70.valid = &local_aec;
                        local_a70.geometryUserPtr = pGVar6->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_9d0;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar145);
                        local_ac0._0_16_ = ZEXT416((uint)fVar144);
                        local_aa0._0_4_ = fVar278;
                        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_018128eb:
                          p_Var7 = context->args->filter;
                          fVar111 = (float)local_900._0_4_;
                          fVar88 = (float)local_900._4_4_;
                          fVar142 = fStack_8f8;
                          fVar272 = fStack_8f4;
                          fVar147 = fStack_8f0;
                          fVar143 = fStack_8ec;
                          fVar275 = fStack_8e8;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              auVar218 = ZEXT1664(auVar218._0_16_);
                              auVar232 = ZEXT1664(auVar232._0_16_);
                              auVar244 = ZEXT1664(auVar244._0_16_);
                              (*p_Var7)(&local_a70);
                              auVar239 = ZEXT1664(local_ae0._0_16_);
                              auVar256 = ZEXT3264(local_8e0);
                              auVar248 = ZEXT3264(local_8c0);
                              auVar198 = ZEXT3264(local_9a0);
                              fVar278 = (float)local_aa0._0_4_;
                              fVar144 = (float)local_ac0._0_4_;
                              uVar84 = local_ac0._4_4_;
                              uVar265 = local_ac0._8_4_;
                              uVar266 = local_ac0._12_4_;
                              fVar111 = (float)local_900._0_4_;
                              fVar88 = (float)local_900._4_4_;
                              fVar142 = fStack_8f8;
                              fVar272 = fStack_8f4;
                              fVar147 = fStack_8f0;
                              fVar143 = fStack_8ec;
                              fVar275 = fStack_8e8;
                            }
                            if (*local_a70.valid == 0) goto LAB_018129b3;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar218 = ZEXT1664(auVar210);
                          auVar232 = ZEXT1664(local_a40._0_16_);
                          auVar244 = ZEXT1664(local_960._0_16_);
                          (*pGVar6->intersectionFilterN)(&local_a70);
                          auVar239 = ZEXT1664(local_ae0._0_16_);
                          auVar256 = ZEXT3264(local_8e0);
                          auVar248 = ZEXT3264(local_8c0);
                          auVar198 = ZEXT3264(local_9a0);
                          fVar278 = (float)local_aa0._0_4_;
                          fVar144 = (float)local_ac0._0_4_;
                          uVar84 = local_ac0._4_4_;
                          uVar265 = local_ac0._8_4_;
                          uVar266 = local_ac0._12_4_;
                          fVar111 = (float)local_900._0_4_;
                          fVar88 = (float)local_900._4_4_;
                          fVar142 = fStack_8f8;
                          fVar272 = fStack_8f4;
                          fVar147 = fStack_8f0;
                          fVar143 = fStack_8ec;
                          fVar275 = fStack_8e8;
                          if (*local_a70.valid != 0) goto LAB_018128eb;
LAB_018129b3:
                          (ray->super_RayK<1>).tfar = fVar278;
                        }
                      }
                    }
                  }
                }
                auVar104 = local_5c0;
                bVar87 = lVar86 != 0;
                lVar86 = lVar86 + -1;
              } while ((!bVar58) && (bVar87));
              fVar144 = (ray->super_RayK<1>).tfar;
              auVar105._4_4_ = fVar144;
              auVar105._0_4_ = fVar144;
              auVar105._8_4_ = fVar144;
              auVar105._12_4_ = fVar144;
              auVar105._16_4_ = fVar144;
              auVar105._20_4_ = fVar144;
              auVar105._24_4_ = fVar144;
              auVar105._28_4_ = fVar144;
              auVar98 = vcmpps_avx(_local_580,auVar105,2);
              local_5c0 = vandps_avx(auVar98,local_5c0);
              auVar183 = ZEXT3264(local_5c0);
              auVar104 = auVar104 & auVar98;
              uVar85 = local_660._0_8_;
            } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar104 >> 0x7f,0) != '\0') ||
                       (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0xbf,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar104[0x1f] < '\0');
          }
          auVar110._0_4_ = fVar111 * (float)local_6a0._0_4_;
          auVar110._4_4_ = fVar88 * (float)local_6a0._4_4_;
          auVar110._8_4_ = fVar142 * fStack_698;
          auVar110._12_4_ = fVar272 * fStack_694;
          auVar110._16_4_ = fVar147 * fStack_690;
          auVar110._20_4_ = fVar143 * fStack_68c;
          auVar110._28_36_ = auVar183._28_36_;
          auVar110._24_4_ = fVar275 * fStack_688;
          auVar95 = vfmadd213ps_fma(local_680,auVar256._0_32_,auVar110._0_32_);
          auVar95 = vfmadd213ps_fma(local_4a0,auVar248._0_32_,ZEXT1632(auVar95));
          auVar104 = vandps_avx(ZEXT1632(auVar95),local_7a0);
          auVar134._8_4_ = 0x3e99999a;
          auVar134._0_8_ = 0x3e99999a3e99999a;
          auVar134._12_4_ = 0x3e99999a;
          auVar134._16_4_ = 0x3e99999a;
          auVar134._20_4_ = 0x3e99999a;
          auVar134._24_4_ = 0x3e99999a;
          auVar134._28_4_ = 0x3e99999a;
          auVar104 = vcmpps_avx(auVar104,auVar134,1);
          auVar98 = vorps_avx(auVar104,local_400);
          auVar135._0_4_ = (float)local_3c0._0_4_ + (float)local_760._0_4_;
          auVar135._4_4_ = (float)local_3c0._4_4_ + (float)local_760._4_4_;
          auVar135._8_4_ = fStack_3b8 + fStack_758;
          auVar135._12_4_ = fStack_3b4 + fStack_754;
          auVar135._16_4_ = fStack_3b0 + fStack_750;
          auVar135._20_4_ = fStack_3ac + fStack_74c;
          auVar135._24_4_ = fStack_3a8 + fStack_748;
          auVar135._28_4_ = fStack_3a4 + fStack_744;
          fVar111 = (ray->super_RayK<1>).tfar;
          auVar157._4_4_ = fVar111;
          auVar157._0_4_ = fVar111;
          auVar157._8_4_ = fVar111;
          auVar157._12_4_ = fVar111;
          auVar157._16_4_ = fVar111;
          auVar157._20_4_ = fVar111;
          auVar157._24_4_ = fVar111;
          auVar157._28_4_ = fVar111;
          auVar104 = vcmpps_avx(auVar135,auVar157,2);
          local_740 = vandps_avx(auVar104,local_3e0);
          auVar136._8_4_ = 3;
          auVar136._0_8_ = 0x300000003;
          auVar136._12_4_ = 3;
          auVar136._16_4_ = 3;
          auVar136._20_4_ = 3;
          auVar136._24_4_ = 3;
          auVar136._28_4_ = 3;
          auVar158._8_4_ = 2;
          auVar158._0_8_ = 0x200000002;
          auVar158._12_4_ = 2;
          auVar158._16_4_ = 2;
          auVar158._20_4_ = 2;
          auVar158._24_4_ = 2;
          auVar158._28_4_ = 2;
          auVar104 = vblendvps_avx(auVar158,auVar136,auVar98);
          _local_780 = vpcmpgtd_avx2(auVar104,local_420);
          local_5e0 = vpandn_avx2(_local_780,local_740);
          auVar104 = local_740 & ~_local_780;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar104 >> 0x7f,0) != '\0') ||
                (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar104 >> 0xbf,0) != '\0') ||
              (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar104[0x1f] < '\0') {
            auVar186 = vminps_avx(local_9e0,local_a00);
            auVar95 = vmaxps_avx(local_9e0,local_a00);
            auVar210 = vminps_avx(local_9f0,_local_a10);
            auVar118 = vminps_avx(auVar186,auVar210);
            auVar186 = vmaxps_avx(local_9f0,_local_a10);
            auVar210 = vmaxps_avx(auVar95,auVar186);
            local_840._8_4_ = 0x7fffffff;
            local_840._0_8_ = 0x7fffffff7fffffff;
            local_840._12_4_ = 0x7fffffff;
            auVar95 = vandps_avx(auVar118,local_840._0_16_);
            auVar186 = vandps_avx(auVar210,local_840._0_16_);
            auVar95 = vmaxps_avx(auVar95,auVar186);
            auVar186 = vmovshdup_avx(auVar95);
            auVar186 = vmaxss_avx(auVar186,auVar95);
            auVar95 = vshufpd_avx(auVar95,auVar95,1);
            auVar95 = vmaxss_avx(auVar95,auVar186);
            local_820._0_4_ = auVar95._0_4_ * 1.9073486e-06;
            local_6e0._0_16_ = vshufps_avx(auVar210,auVar210,0xff);
            local_700 = _local_520;
            local_720._4_4_ = (float)local_520._4_4_ + (float)local_760._4_4_;
            local_720._0_4_ = (float)local_520._0_4_ + (float)local_760._0_4_;
            fStack_718 = fStack_518 + fStack_758;
            fStack_714 = fStack_514 + fStack_754;
            fStack_710 = fStack_510 + fStack_750;
            fStack_70c = fStack_50c + fStack_74c;
            fStack_708 = fStack_508 + fStack_748;
            fStack_704 = fStack_504 + fStack_744;
            do {
              auVar137._8_4_ = 0x7f800000;
              auVar137._0_8_ = 0x7f8000007f800000;
              auVar137._12_4_ = 0x7f800000;
              auVar137._16_4_ = 0x7f800000;
              auVar137._20_4_ = 0x7f800000;
              auVar137._24_4_ = 0x7f800000;
              auVar137._28_4_ = 0x7f800000;
              auVar104 = vblendvps_avx(auVar137,local_700,local_5e0);
              auVar98 = vshufps_avx(auVar104,auVar104,0xb1);
              auVar98 = vminps_avx(auVar104,auVar98);
              auVar140 = vshufpd_avx(auVar98,auVar98,5);
              auVar98 = vminps_avx(auVar98,auVar140);
              auVar140 = vpermpd_avx2(auVar98,0x4e);
              auVar98 = vminps_avx(auVar98,auVar140);
              auVar98 = vcmpps_avx(auVar104,auVar98,0);
              auVar140 = local_5e0 & auVar98;
              auVar104 = local_5e0;
              if ((((((((auVar140 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar140 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar140 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar140 >> 0x7f,0) != '\0') ||
                    (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar140 >> 0xbf,0) != '\0') ||
                  (auVar140 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar140[0x1f] < '\0') {
                auVar104 = vandps_avx(auVar98,local_5e0);
              }
              uVar80 = vmovmskps_avx(auVar104);
              iVar14 = 0;
              for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
                iVar14 = iVar14 + 1;
              }
              uVar80 = iVar14 << 2;
              *(undefined4 *)(local_5e0 + uVar80) = 0;
              aVar1 = (ray->super_RayK<1>).dir.field_0;
              _local_800 = (undefined1  [16])aVar1;
              auVar95 = vdpps_avx((undefined1  [16])aVar1,(undefined1  [16])aVar1,0x7f);
              auVar183 = ZEXT464(*(uint *)(local_560 + uVar80));
              auVar232 = ZEXT464(*(uint *)(local_500 + uVar80));
              if (auVar95._0_4_ < 0.0) {
                local_ae0._0_16_ = ZEXT416(*(uint *)(local_560 + uVar80));
                local_ac0._0_16_ = ZEXT416(*(uint *)(local_500 + uVar80));
                fVar111 = sqrtf(auVar95._0_4_);
                auVar232 = ZEXT1664(local_ac0._0_16_);
                auVar183 = ZEXT1664(local_ae0._0_16_);
              }
              else {
                auVar95 = vsqrtss_avx(auVar95,auVar95);
                fVar111 = auVar95._0_4_;
              }
              local_960._0_4_ = fVar111 * 1.9073486e-06;
              lVar86 = 4;
              do {
                fVar88 = auVar183._0_4_;
                fVar111 = 1.0 - fVar88;
                local_940._0_16_ = ZEXT416((uint)fVar111);
                auVar121._0_4_ = local_a00._0_4_ * fVar88;
                auVar121._4_4_ = local_a00._4_4_ * fVar88;
                auVar121._8_4_ = local_a00._8_4_ * fVar88;
                auVar121._12_4_ = local_a00._12_4_ * fVar88;
                auVar150._4_4_ = fVar111;
                auVar150._0_4_ = fVar111;
                auVar150._8_4_ = fVar111;
                auVar150._12_4_ = fVar111;
                auVar95 = vfmadd231ps_fma(auVar121,auVar150,local_9e0);
                auVar170._0_4_ = local_9f0._0_4_ * fVar88;
                auVar170._4_4_ = local_9f0._4_4_ * fVar88;
                auVar170._8_4_ = local_9f0._8_4_ * fVar88;
                auVar170._12_4_ = local_9f0._12_4_ * fVar88;
                auVar186 = vfmadd231ps_fma(auVar170,auVar150,local_a00);
                auVar209._0_4_ = fVar88 * auVar186._0_4_;
                auVar209._4_4_ = fVar88 * auVar186._4_4_;
                auVar209._8_4_ = fVar88 * auVar186._8_4_;
                auVar209._12_4_ = fVar88 * auVar186._12_4_;
                auVar210 = vfmadd231ps_fma(auVar209,auVar150,auVar95);
                auVar122._0_4_ = fVar88 * (float)local_a10._0_4_;
                auVar122._4_4_ = fVar88 * (float)local_a10._4_4_;
                auVar122._8_4_ = fVar88 * fStack_a08;
                auVar122._12_4_ = fVar88 * fStack_a04;
                auVar95 = vfmadd231ps_fma(auVar122,auVar150,local_9f0);
                auVar188._0_4_ = fVar88 * auVar95._0_4_;
                auVar188._4_4_ = fVar88 * auVar95._4_4_;
                auVar188._8_4_ = fVar88 * auVar95._8_4_;
                auVar188._12_4_ = fVar88 * auVar95._12_4_;
                auVar186 = vfmadd231ps_fma(auVar188,auVar150,auVar186);
                uVar84 = auVar232._0_4_;
                auVar123._4_4_ = uVar84;
                auVar123._0_4_ = uVar84;
                auVar123._8_4_ = uVar84;
                auVar123._12_4_ = uVar84;
                auVar95 = vfmadd213ps_fma(auVar123,_local_800,_DAT_01feba10);
                auVar94._0_4_ = fVar88 * auVar186._0_4_;
                auVar94._4_4_ = fVar88 * auVar186._4_4_;
                auVar94._8_4_ = fVar88 * auVar186._8_4_;
                auVar94._12_4_ = fVar88 * auVar186._12_4_;
                auVar118 = vfmadd231ps_fma(auVar94,auVar210,auVar150);
                local_880._0_16_ = auVar118;
                auVar95 = vsubps_avx(auVar95,auVar118);
                _local_920 = auVar95;
                auVar95 = vdpps_avx(auVar95,auVar95,0x7f);
                local_ae0._0_16_ = auVar183._0_16_;
                local_ac0._0_16_ = auVar232._0_16_;
                local_aa0._0_16_ = auVar95;
                if (auVar95._0_4_ < 0.0) {
                  local_940._0_16_ = ZEXT416((uint)fVar111);
                  local_8a0._0_16_ = auVar210;
                  local_a40._0_16_ = auVar186;
                  auVar239._0_4_ = sqrtf(auVar95._0_4_);
                  auVar239._4_60_ = extraout_var_00;
                  auVar232 = ZEXT1664(local_ac0._0_16_);
                  auVar95 = auVar239._0_16_;
                  auVar186 = local_a40._0_16_;
                  auVar210 = local_8a0._0_16_;
                  auVar118 = local_ae0._0_16_;
                }
                else {
                  auVar95 = vsqrtss_avx(auVar95,auVar95);
                  auVar118 = auVar183._0_16_;
                }
                auVar186 = vsubps_avx(auVar186,auVar210);
                auVar235._0_4_ = auVar186._0_4_ * 3.0;
                auVar235._4_4_ = auVar186._4_4_ * 3.0;
                auVar235._8_4_ = auVar186._8_4_ * 3.0;
                auVar235._12_4_ = auVar186._12_4_ * 3.0;
                auVar186 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_940._0_16_,auVar118)
                ;
                auVar210 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar118,local_940._0_16_)
                ;
                fVar111 = local_940._0_4_ * 6.0;
                fVar88 = auVar186._0_4_ * 6.0;
                fVar142 = auVar210._0_4_ * 6.0;
                fVar272 = auVar118._0_4_ * 6.0;
                auVar171._0_4_ = fVar272 * (float)local_a10._0_4_;
                auVar171._4_4_ = fVar272 * (float)local_a10._4_4_;
                auVar171._8_4_ = fVar272 * fStack_a08;
                auVar171._12_4_ = fVar272 * fStack_a04;
                auVar124._4_4_ = fVar142;
                auVar124._0_4_ = fVar142;
                auVar124._8_4_ = fVar142;
                auVar124._12_4_ = fVar142;
                auVar186 = vfmadd132ps_fma(auVar124,auVar171,local_9f0);
                auVar172._4_4_ = fVar88;
                auVar172._0_4_ = fVar88;
                auVar172._8_4_ = fVar88;
                auVar172._12_4_ = fVar88;
                auVar186 = vfmadd132ps_fma(auVar172,auVar186,local_a00);
                auVar210 = vdpps_avx(auVar235,auVar235,0x7f);
                auVar125._4_4_ = fVar111;
                auVar125._0_4_ = fVar111;
                auVar125._8_4_ = fVar111;
                auVar125._12_4_ = fVar111;
                auVar3 = vfmadd132ps_fma(auVar125,auVar186,local_9e0);
                auVar186 = vblendps_avx(auVar210,_DAT_01feba10,0xe);
                auVar118 = vrsqrtss_avx(auVar186,auVar186);
                fVar142 = auVar210._0_4_;
                fVar111 = auVar118._0_4_;
                auVar118 = vdpps_avx(auVar235,auVar3,0x7f);
                fVar111 = fVar111 * 1.5 + fVar142 * -0.5 * fVar111 * fVar111 * fVar111;
                auVar126._0_4_ = auVar3._0_4_ * fVar142;
                auVar126._4_4_ = auVar3._4_4_ * fVar142;
                auVar126._8_4_ = auVar3._8_4_ * fVar142;
                auVar126._12_4_ = auVar3._12_4_ * fVar142;
                fVar88 = auVar118._0_4_;
                auVar211._0_4_ = auVar235._0_4_ * fVar88;
                auVar211._4_4_ = auVar235._4_4_ * fVar88;
                auVar211._8_4_ = auVar235._8_4_ * fVar88;
                auVar211._12_4_ = auVar235._12_4_ * fVar88;
                auVar118 = vsubps_avx(auVar126,auVar211);
                auVar186 = vrcpss_avx(auVar186,auVar186);
                auVar3 = vfnmadd213ss_fma(auVar186,auVar210,ZEXT416(0x40000000));
                fVar88 = auVar186._0_4_ * auVar3._0_4_;
                auVar186 = vmaxss_avx(ZEXT416((uint)local_820._0_4_),
                                      ZEXT416((uint)(auVar232._0_4_ * (float)local_960._0_4_)));
                auVar248 = ZEXT1664(auVar186);
                uVar85 = CONCAT44(auVar235._4_4_,auVar235._0_4_);
                auVar219._0_8_ = uVar85 ^ 0x8000000080000000;
                auVar219._8_4_ = -auVar235._8_4_;
                auVar219._12_4_ = -auVar235._12_4_;
                auVar173._0_4_ = fVar111 * auVar118._0_4_ * fVar88;
                auVar173._4_4_ = fVar111 * auVar118._4_4_ * fVar88;
                auVar173._8_4_ = fVar111 * auVar118._8_4_ * fVar88;
                auVar173._12_4_ = fVar111 * auVar118._12_4_ * fVar88;
                auVar226._0_4_ = auVar235._0_4_ * fVar111;
                auVar226._4_4_ = auVar235._4_4_ * fVar111;
                auVar226._8_4_ = auVar235._8_4_ * fVar111;
                auVar226._12_4_ = auVar235._12_4_ * fVar111;
                local_940._0_16_ = auVar235;
                local_8a0._0_4_ = auVar186._0_4_;
                if (fVar142 < -fVar142) {
                  local_a40._0_4_ = auVar95._0_4_;
                  local_980._0_16_ = auVar219;
                  local_860._0_16_ = auVar226;
                  local_9a0._0_16_ = auVar173;
                  fVar111 = sqrtf(fVar142);
                  auVar95 = ZEXT416((uint)local_a40._0_4_);
                  auVar248 = ZEXT464((uint)local_8a0._0_4_);
                  auVar173 = local_9a0._0_16_;
                  auVar219 = local_980._0_16_;
                  auVar226 = local_860._0_16_;
                }
                else {
                  auVar186 = vsqrtss_avx(auVar210,auVar210);
                  fVar111 = auVar186._0_4_;
                }
                auVar186 = vdpps_avx(_local_920,auVar226,0x7f);
                auVar261 = vfmadd213ss_fma(ZEXT416((uint)local_820._0_4_),auVar95,auVar248._0_16_);
                auVar210 = vdpps_avx(auVar219,auVar226,0x7f);
                auVar118 = vdpps_avx(_local_920,auVar173,0x7f);
                auVar3 = vdpps_avx(_local_800,auVar226,0x7f);
                auVar261 = vfmadd213ss_fma(ZEXT416((uint)(auVar95._0_4_ + 1.0)),
                                           ZEXT416((uint)((float)local_820._0_4_ / fVar111)),
                                           auVar261);
                auVar256 = ZEXT1664(auVar261);
                fVar111 = auVar210._0_4_ + auVar118._0_4_;
                auVar96._0_4_ = auVar186._0_4_ * auVar186._0_4_;
                auVar96._4_4_ = auVar186._4_4_ * auVar186._4_4_;
                auVar96._8_4_ = auVar186._8_4_ * auVar186._8_4_;
                auVar96._12_4_ = auVar186._12_4_ * auVar186._12_4_;
                auVar95 = vdpps_avx(_local_920,auVar219,0x7f);
                auVar118 = vsubps_avx(local_aa0._0_16_,auVar96);
                auVar210 = vrsqrtss_avx(auVar118,auVar118);
                fVar142 = auVar118._0_4_;
                fVar88 = auVar210._0_4_;
                fVar88 = fVar88 * 1.5 + fVar142 * -0.5 * fVar88 * fVar88 * fVar88;
                auVar210 = vdpps_avx(_local_920,_local_800,0x7f);
                auVar95 = vfnmadd231ss_fma(auVar95,auVar186,ZEXT416((uint)fVar111));
                auVar210 = vfnmadd231ss_fma(auVar210,auVar186,auVar3);
                if (fVar142 < 0.0) {
                  local_a40._0_16_ = auVar186;
                  local_980._0_4_ = auVar261._0_4_;
                  local_860._0_16_ = ZEXT416((uint)fVar111);
                  local_9a0._0_16_ = auVar3;
                  local_8c0._0_16_ = auVar95;
                  local_8e0._0_4_ = fVar88;
                  _local_900 = auVar210;
                  fVar142 = sqrtf(fVar142);
                  auVar256 = ZEXT464((uint)local_980._0_4_);
                  auVar248 = ZEXT464((uint)local_8a0._0_4_);
                  fVar88 = (float)local_8e0._0_4_;
                  auVar210 = _local_900;
                  auVar118 = local_aa0._0_16_;
                  auVar186 = local_a40._0_16_;
                  auVar3 = local_9a0._0_16_;
                  auVar95 = local_8c0._0_16_;
                  auVar261 = local_860._0_16_;
                }
                else {
                  auVar118 = vsqrtss_avx(auVar118,auVar118);
                  fVar142 = auVar118._0_4_;
                  auVar118 = local_aa0._0_16_;
                  auVar261 = ZEXT416((uint)fVar111);
                }
                auVar244 = ZEXT1664(auVar118);
                auVar239 = ZEXT1664(local_940._0_16_);
                auVar127 = vpermilps_avx(local_880._0_16_,0xff);
                auVar4 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xff);
                auVar95 = vfmsub213ss_fma(auVar95,ZEXT416((uint)fVar88),auVar4);
                auVar174._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
                auVar174._8_4_ = auVar3._8_4_ ^ 0x80000000;
                auVar174._12_4_ = auVar3._12_4_ ^ 0x80000000;
                auVar189._0_8_ = auVar95._0_8_ ^ 0x8000000080000000;
                auVar189._8_4_ = auVar95._8_4_ ^ 0x80000000;
                auVar189._12_4_ = auVar95._12_4_ ^ 0x80000000;
                auVar151 = ZEXT416((uint)(auVar210._0_4_ * fVar88));
                auVar210 = vfmsub231ss_fma(ZEXT416((uint)(auVar3._0_4_ * auVar95._0_4_)),auVar261,
                                           auVar151);
                auVar95 = vinsertps_avx(auVar151,auVar174,0x10);
                uVar84 = auVar210._0_4_;
                auVar175._4_4_ = uVar84;
                auVar175._0_4_ = uVar84;
                auVar175._8_4_ = uVar84;
                auVar175._12_4_ = uVar84;
                auVar95 = vdivps_avx(auVar95,auVar175);
                auVar127 = ZEXT416((uint)(fVar142 - auVar127._0_4_));
                auVar3 = vinsertps_avx(auVar186,auVar127,0x10);
                auVar218 = ZEXT1664(auVar3);
                auVar152._0_4_ = auVar3._0_4_ * auVar95._0_4_;
                auVar152._4_4_ = auVar3._4_4_ * auVar95._4_4_;
                auVar152._8_4_ = auVar3._8_4_ * auVar95._8_4_;
                auVar152._12_4_ = auVar3._12_4_ * auVar95._12_4_;
                auVar95 = vinsertps_avx(auVar189,auVar261,0x1c);
                auVar95 = vdivps_avx(auVar95,auVar175);
                auVar176._0_4_ = auVar3._0_4_ * auVar95._0_4_;
                auVar176._4_4_ = auVar3._4_4_ * auVar95._4_4_;
                auVar176._8_4_ = auVar3._8_4_ * auVar95._8_4_;
                auVar176._12_4_ = auVar3._12_4_ * auVar95._12_4_;
                auVar95 = vhaddps_avx(auVar152,auVar152);
                auVar210 = vhaddps_avx(auVar176,auVar176);
                fVar88 = (float)local_ae0._0_4_ - auVar95._0_4_;
                auVar183 = ZEXT464((uint)fVar88);
                fVar111 = (float)local_ac0._0_4_ - auVar210._0_4_;
                auVar232 = ZEXT464((uint)fVar111);
                auVar95 = vandps_avx(auVar186,local_840._0_16_);
                if (auVar256._0_4_ <= auVar95._0_4_) {
LAB_018131f8:
                  bVar58 = false;
                }
                else {
                  auVar186 = vfmadd231ss_fma(ZEXT416((uint)(auVar248._0_4_ + auVar256._0_4_)),
                                             local_6e0._0_16_,ZEXT416(0x36000000));
                  auVar95 = vandps_avx(auVar127,local_840._0_16_);
                  if (auVar186._0_4_ <= auVar95._0_4_) goto LAB_018131f8;
                  fVar111 = fVar111 + (float)local_7d0._0_4_;
                  auVar232 = ZEXT464((uint)fVar111);
                  bVar58 = true;
                  if (((((ray->super_RayK<1>).org.field_0.m128[3] <= fVar111) &&
                       (fVar142 = (ray->super_RayK<1>).tfar, fVar111 <= fVar142)) && (0.0 <= fVar88)
                      ) && (fVar88 <= 1.0)) {
                    auVar95 = vrsqrtss_avx(auVar118,auVar118);
                    fVar272 = auVar95._0_4_;
                    pGVar6 = (context->scene->geometries).items[local_ae8].ptr;
                    if ((pGVar6->mask & (ray->super_RayK<1>).mask) != 0) {
                      fVar272 = fVar272 * 1.5 + auVar118._0_4_ * -0.5 * fVar272 * fVar272 * fVar272;
                      auVar128._0_4_ = fVar272 * (float)local_920._0_4_;
                      auVar128._4_4_ = fVar272 * (float)local_920._4_4_;
                      auVar128._8_4_ = fVar272 * fStack_918;
                      auVar128._12_4_ = fVar272 * fStack_914;
                      auVar261 = vfmadd213ps_fma(auVar4,auVar128,local_940._0_16_);
                      auVar95 = vshufps_avx(auVar128,auVar128,0xc9);
                      auVar186 = vshufps_avx(local_940._0_16_,local_940._0_16_,0xc9);
                      auVar129._0_4_ = auVar128._0_4_ * auVar186._0_4_;
                      auVar129._4_4_ = auVar128._4_4_ * auVar186._4_4_;
                      auVar129._8_4_ = auVar128._8_4_ * auVar186._8_4_;
                      auVar129._12_4_ = auVar128._12_4_ * auVar186._12_4_;
                      auVar210 = vfmsub231ps_fma(auVar129,local_940._0_16_,auVar95);
                      auVar95 = vshufps_avx(auVar210,auVar210,0xc9);
                      auVar186 = vshufps_avx(auVar261,auVar261,0xc9);
                      auVar210 = vshufps_avx(auVar210,auVar210,0xd2);
                      auVar97._0_4_ = auVar261._0_4_ * auVar210._0_4_;
                      auVar97._4_4_ = auVar261._4_4_ * auVar210._4_4_;
                      auVar97._8_4_ = auVar261._8_4_ * auVar210._8_4_;
                      auVar97._12_4_ = auVar261._12_4_ * auVar210._12_4_;
                      auVar95 = vfmsub231ps_fma(auVar97,auVar95,auVar186);
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                        (ray->super_RayK<1>).tfar = fVar111;
                        auVar186 = vshufps_avx(auVar95,auVar95,0xe9);
                        uVar224 = vmovlps_avx(auVar186);
                        *(undefined8 *)&(ray->Ng).field_0 = uVar224;
                        (ray->Ng).field_0.field_0.z = auVar95._0_4_;
                        ray->u = fVar88;
                        ray->v = 0.0;
                        ray->primID = uVar82;
                        ray->geomID = (uint)local_ae8;
                        ray->instID[0] = context->user->instID[0];
                        ray->instPrimID[0] = context->user->instPrimID[0];
                      }
                      else {
                        auVar186 = vshufps_avx(auVar95,auVar95,0xe9);
                        local_9d0 = vmovlps_avx(auVar186);
                        local_9c8 = auVar95._0_4_;
                        local_9c4 = fVar88;
                        local_9c0 = 0;
                        local_9bc = uVar82;
                        local_9b8 = (uint)local_ae8;
                        local_9b4 = context->user->instID[0];
                        local_9b0 = context->user->instPrimID[0];
                        (ray->super_RayK<1>).tfar = fVar111;
                        local_aec = -1;
                        local_a70.valid = &local_aec;
                        local_a70.geometryUserPtr = pGVar6->userPtr;
                        local_a70.context = context->user;
                        local_a70.ray = (RTCRayN *)ray;
                        local_a70.hit = (RTCHitN *)&local_9d0;
                        local_a70.N = 1;
                        local_ae0._0_16_ = ZEXT416((uint)fVar88);
                        local_ac0._0_16_ = ZEXT416((uint)fVar111);
                        local_aa0._0_4_ = fVar142;
                        if (pGVar6->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_0181331c:
                          p_Var7 = context->args->filter;
                          if (p_Var7 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar6->field_8).field_0x2 & 0x40) != 0)) {
                              auVar218 = ZEXT1664(auVar218._0_16_);
                              auVar239 = ZEXT1664(auVar239._0_16_);
                              auVar244 = ZEXT1664(auVar244._0_16_);
                              auVar248 = ZEXT1664(auVar248._0_16_);
                              auVar256 = ZEXT1664(auVar256._0_16_);
                              (*p_Var7)(&local_a70);
                              auVar232 = ZEXT1664(local_ac0._0_16_);
                              auVar183 = ZEXT1664(local_ae0._0_16_);
                              fVar142 = (float)local_aa0._0_4_;
                            }
                            if (*local_a70.valid == 0) goto LAB_018133c0;
                          }
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).components[0] =
                               *(float *)local_a70.hit;
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.y =
                               *(float *)(local_a70.hit + 4);
                          (((Vec3f *)((long)local_a70.ray + 0x30))->field_0).field_0.z =
                               *(float *)(local_a70.hit + 8);
                          *(float *)((long)local_a70.ray + 0x3c) = *(float *)(local_a70.hit + 0xc);
                          *(float *)((long)local_a70.ray + 0x40) = *(float *)(local_a70.hit + 0x10);
                          *(float *)((long)local_a70.ray + 0x44) = *(float *)(local_a70.hit + 0x14);
                          *(float *)((long)local_a70.ray + 0x48) = *(float *)(local_a70.hit + 0x18);
                          *(float *)((long)local_a70.ray + 0x4c) = *(float *)(local_a70.hit + 0x1c);
                          *(float *)((long)local_a70.ray + 0x50) = *(float *)(local_a70.hit + 0x20);
                        }
                        else {
                          auVar218 = ZEXT1664(auVar3);
                          auVar239 = ZEXT1664(local_940._0_16_);
                          auVar244 = ZEXT1664(auVar118);
                          auVar248 = ZEXT1664(auVar248._0_16_);
                          auVar256 = ZEXT1664(auVar256._0_16_);
                          (*pGVar6->intersectionFilterN)(&local_a70);
                          auVar232 = ZEXT1664(local_ac0._0_16_);
                          auVar183 = ZEXT1664(local_ae0._0_16_);
                          fVar142 = (float)local_aa0._0_4_;
                          if (*local_a70.valid != 0) goto LAB_0181331c;
LAB_018133c0:
                          (ray->super_RayK<1>).tfar = fVar142;
                        }
                      }
                    }
                  }
                }
                auVar104 = local_5e0;
                bVar87 = lVar86 != 0;
                lVar86 = lVar86 + -1;
              } while ((!bVar58) && (bVar87));
              fVar111 = (ray->super_RayK<1>).tfar;
              auVar106._4_4_ = fVar111;
              auVar106._0_4_ = fVar111;
              auVar106._8_4_ = fVar111;
              auVar106._12_4_ = fVar111;
              auVar106._16_4_ = fVar111;
              auVar106._20_4_ = fVar111;
              auVar106._24_4_ = fVar111;
              auVar106._28_4_ = fVar111;
              auVar98 = vcmpps_avx(_local_720,auVar106,2);
              local_5e0 = vandps_avx(auVar98,local_5e0);
              auVar104 = auVar104 & auVar98;
              uVar85 = local_660._0_8_;
            } while ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                          (auVar104 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                         (auVar104 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                        SUB321(auVar104 >> 0x7f,0) != '\0') ||
                       (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                      SUB321(auVar104 >> 0xbf,0) != '\0') ||
                     (auVar104 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                     auVar104[0x1f] < '\0');
          }
          auVar138._0_4_ = (float)local_760._0_4_ + local_4e0._0_4_;
          auVar138._4_4_ = (float)local_760._4_4_ + local_4e0._4_4_;
          auVar138._8_4_ = fStack_758 + local_4e0._8_4_;
          auVar138._12_4_ = fStack_754 + local_4e0._12_4_;
          auVar138._16_4_ = fStack_750 + local_4e0._16_4_;
          auVar138._20_4_ = fStack_74c + local_4e0._20_4_;
          auVar138._24_4_ = fStack_748 + local_4e0._24_4_;
          auVar138._28_4_ = fStack_744 + local_4e0._28_4_;
          fVar111 = (ray->super_RayK<1>).tfar;
          auVar181._4_4_ = fVar111;
          auVar181._0_4_ = fVar111;
          auVar181._8_4_ = fVar111;
          auVar181._12_4_ = fVar111;
          auVar181._16_4_ = fVar111;
          auVar181._20_4_ = fVar111;
          auVar181._24_4_ = fVar111;
          auVar181._28_4_ = fVar111;
          auVar98 = vcmpps_avx(auVar138,auVar181,2);
          auVar104 = vandps_avx(local_6c0,local_5a0);
          auVar104 = vandps_avx(auVar98,auVar104);
          auVar197._0_4_ = (float)local_760._0_4_ + local_520._0_4_;
          auVar197._4_4_ = (float)local_760._4_4_ + local_520._4_4_;
          auVar197._8_4_ = fStack_758 + local_520._8_4_;
          auVar197._12_4_ = fStack_754 + local_520._12_4_;
          auVar197._16_4_ = fStack_750 + local_520._16_4_;
          auVar197._20_4_ = fStack_74c + local_520._20_4_;
          auVar197._24_4_ = fStack_748 + local_520._24_4_;
          auVar197._28_4_ = fStack_744 + local_520._28_4_;
          auVar140 = vcmpps_avx(auVar197,auVar181,2);
          auVar98 = vandps_avx(_local_780,local_740);
          auVar98 = vandps_avx(auVar140,auVar98);
          auVar98 = vorps_avx(auVar104,auVar98);
          if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar98 >> 0x7f,0) != '\0') ||
                (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0xbf,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar98[0x1f] < '\0') {
            *(undefined1 (*) [32])(auStack_180 + uVar81 * 0x60) = auVar98;
            auVar104 = vblendvps_avx(_local_520,local_4e0,auVar104);
            *(undefined1 (*) [32])(auStack_160 + uVar81 * 0x60) = auVar104;
            auVar67._8_8_ = uStack_7d8;
            auVar67._0_8_ = local_7e0;
            uVar224 = vmovlps_avx(auVar67);
            *(undefined8 *)(afStack_140 + uVar81 * 0x18) = uVar224;
            auStack_138[uVar81 * 0x18] = (int)uVar85 + 1;
            uVar81 = (ulong)((int)uVar81 + 1);
          }
        }
      }
    }
    fVar111 = (ray->super_RayK<1>).tfar;
    auVar107._4_4_ = fVar111;
    auVar107._0_4_ = fVar111;
    auVar107._8_4_ = fVar111;
    auVar107._12_4_ = fVar111;
    auVar107._16_4_ = fVar111;
    auVar107._20_4_ = fVar111;
    auVar107._24_4_ = fVar111;
    auVar107._28_4_ = fVar111;
    do {
      if ((int)uVar81 == 0) {
        fVar111 = (ray->super_RayK<1>).tfar;
        auVar109._4_4_ = fVar111;
        auVar109._0_4_ = fVar111;
        auVar109._8_4_ = fVar111;
        auVar109._12_4_ = fVar111;
        auVar109._16_4_ = fVar111;
        auVar109._20_4_ = fVar111;
        auVar109._24_4_ = fVar111;
        auVar109._28_4_ = fVar111;
        auVar104 = vcmpps_avx(local_3a0,auVar109,2);
        uVar82 = vmovmskps_avx(auVar104);
        uVar82 = (uint)local_7a8 & uVar82;
        if (uVar82 == 0) {
          return;
        }
        goto LAB_018111df;
      }
      uVar83 = (ulong)((int)uVar81 - 1);
      lVar86 = uVar83 * 0x60;
      auVar98 = *(undefined1 (*) [32])(auStack_180 + lVar86);
      auVar104 = *(undefined1 (*) [32])(auStack_160 + lVar86);
      auVar139._0_4_ = auVar104._0_4_ + (float)local_760._0_4_;
      auVar139._4_4_ = auVar104._4_4_ + (float)local_760._4_4_;
      auVar139._8_4_ = auVar104._8_4_ + fStack_758;
      auVar139._12_4_ = auVar104._12_4_ + fStack_754;
      auVar139._16_4_ = auVar104._16_4_ + fStack_750;
      auVar139._20_4_ = auVar104._20_4_ + fStack_74c;
      auVar139._24_4_ = auVar104._24_4_ + fStack_748;
      auVar139._28_4_ = auVar104._28_4_ + fStack_744;
      auVar12 = vcmpps_avx(auVar139,auVar107,2);
      auVar140 = vandps_avx(auVar12,auVar98);
      local_4e0 = auVar140;
      auVar154 = auVar98 & auVar12;
      bVar64 = (auVar154 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar65 = (auVar154 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar63 = (auVar154 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0;
      bVar62 = SUB321(auVar154 >> 0x7f,0) == '\0';
      bVar61 = (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar60 = SUB321(auVar154 >> 0xbf,0) == '\0';
      bVar87 = (auVar154 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0;
      bVar58 = -1 < auVar154[0x1f];
      if (((((((!bVar64 || !bVar65) || !bVar63) || !bVar62) || !bVar61) || !bVar60) || !bVar87) ||
          !bVar58) {
        auVar182._8_4_ = 0x7f800000;
        auVar182._0_8_ = 0x7f8000007f800000;
        auVar182._12_4_ = 0x7f800000;
        auVar182._16_4_ = 0x7f800000;
        auVar182._20_4_ = 0x7f800000;
        auVar182._24_4_ = 0x7f800000;
        auVar182._28_4_ = 0x7f800000;
        auVar104 = vblendvps_avx(auVar182,auVar104,auVar140);
        auVar98 = vshufps_avx(auVar104,auVar104,0xb1);
        auVar98 = vminps_avx(auVar104,auVar98);
        auVar12 = vshufpd_avx(auVar98,auVar98,5);
        auVar98 = vminps_avx(auVar98,auVar12);
        auVar12 = vpermpd_avx2(auVar98,0x4e);
        auVar98 = vminps_avx(auVar98,auVar12);
        auVar104 = vcmpps_avx(auVar104,auVar98,0);
        auVar98 = auVar140 & auVar104;
        if ((((((((auVar98 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar98 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar98 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar98 >> 0x7f,0) != '\0') ||
              (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar98 >> 0xbf,0) != '\0') ||
            (auVar98 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar98[0x1f] < '\0') {
          auVar140 = vandps_avx(auVar104,auVar140);
        }
        fVar111 = afStack_140[uVar83 * 0x18 + 1];
        uVar85 = (ulong)auStack_138[uVar83 * 0x18];
        uVar80 = vmovmskps_avx(auVar140);
        iVar14 = 0;
        for (; (uVar80 & 1) == 0; uVar80 = uVar80 >> 1 | 0x80000000) {
          iVar14 = iVar14 + 1;
        }
        fVar88 = afStack_140[uVar83 * 0x18];
        auVar141._4_4_ = fVar88;
        auVar141._0_4_ = fVar88;
        auVar141._8_4_ = fVar88;
        auVar141._12_4_ = fVar88;
        auVar141._16_4_ = fVar88;
        auVar141._20_4_ = fVar88;
        auVar141._24_4_ = fVar88;
        auVar141._28_4_ = fVar88;
        *(undefined4 *)(local_4e0 + (uint)(iVar14 << 2)) = 0;
        *(undefined1 (*) [32])(auStack_180 + lVar86) = local_4e0;
        if ((((((((local_4e0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (local_4e0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (local_4e0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(local_4e0 >> 0x7f,0) != '\0') ||
              (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(local_4e0 >> 0xbf,0) != '\0') ||
            (local_4e0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            local_4e0[0x1f] < '\0') {
          uVar83 = uVar81;
        }
        fVar111 = fVar111 - fVar88;
        auVar159._4_4_ = fVar111;
        auVar159._0_4_ = fVar111;
        auVar159._8_4_ = fVar111;
        auVar159._12_4_ = fVar111;
        auVar159._16_4_ = fVar111;
        auVar159._20_4_ = fVar111;
        auVar159._24_4_ = fVar111;
        auVar159._28_4_ = fVar111;
        auVar95 = vfmadd132ps_fma(auVar159,auVar141,_DAT_02020f20);
        _local_520 = ZEXT1632(auVar95);
        local_7e0 = *(undefined8 *)(local_520 + (uint)(iVar14 << 2));
        uStack_7d8 = 0;
        auVar98 = local_4e0;
      }
      uVar81 = uVar83;
      auVar198 = ZEXT3264(auVar12);
      auVar183 = ZEXT3264(auVar98);
    } while (((((((bVar64 && bVar65) && bVar63) && bVar62) && bVar61) && bVar60) && bVar87) &&
             bVar58);
  } while( true );
}

Assistant:

static __forceinline void intersect_t(const Precalculations& pre, RayHit& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }

          Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
      }